

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void snapshot_stats_test(void)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  fdb_doc *doc;
  hbtrie **pphVar4;
  fdb_status fVar5;
  int iVar6;
  fdb_status fVar7;
  fdb_status extraout_EAX;
  fdb_config *pfVar8;
  size_t sVar9;
  fdb_kvs_handle *pfVar10;
  size_t sVar11;
  size_t sVar12;
  __atomic_base<unsigned_long> handle;
  __atomic_base<unsigned_long> _Var13;
  char *handle_00;
  fdb_kvs_handle *pfVar14;
  fdb_iterator *doc_00;
  fdb_kvs_handle *pfVar15;
  fdb_kvs_handle *pfVar16;
  fdb_kvs_handle *in_RCX;
  btree *extraout_RDX;
  ulong uVar17;
  hbtrie **seqnum;
  fdb_kvs_handle *doc_01;
  uint uVar18;
  char *pcVar19;
  fdb_iterator *pfVar20;
  char *unaff_R12;
  fdb_kvs_handle *pfVar21;
  char *unaff_R13;
  long lVar22;
  char *pcVar23;
  btree *__s;
  fdb_doc **ppfVar24;
  fdb_iterator *config;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *snap_db;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_doc *pfStack_2100;
  fdb_iterator *pfStack_20f8;
  int iStack_20ec;
  fdb_kvs_handle *pfStack_20e8;
  timeval tStack_20e0;
  fdb_kvs_handle *pfStack_20d0;
  fdb_kvs_handle *pfStack_20c8;
  fdb_kvs_handle *pfStack_20c0;
  fdb_kvs_handle *pfStack_20b8;
  fdb_iterator *pfStack_20b0;
  fdb_iterator *pfStack_20a8;
  fdb_kvs_handle *pfStack_2098;
  fdb_kvs_handle *pfStack_2090;
  undefined1 auStack_2088 [24];
  fdb_kvs_handle *pfStack_2070;
  fdb_kvs_handle *pfStack_2068;
  fdb_kvs_handle *pfStack_2060;
  fdb_kvs_handle *pfStack_2058;
  undefined1 auStack_2050 [80];
  undefined8 auStack_2000 [5];
  fdb_doc *apfStack_1fd8 [6];
  fdb_kvs_info fStack_1fa8;
  timeval tStack_1f78;
  undefined1 auStack_1f68 [280];
  fdb_iterator fStack_1e50;
  fdb_kvs_handle fStack_1d50;
  fdb_kvs_handle *pfStack_1b48;
  btree *pbStack_1b40;
  fdb_kvs_handle *pfStack_1b38;
  code *pcStack_1b30;
  fdb_iterator *pfStack_1b20;
  fdb_kvs_handle *pfStack_1b18;
  fdb_kvs_handle *pfStack_1b10;
  fdb_kvs_handle *pfStack_1b08;
  atomic<unsigned_long> *paStack_1b00;
  size_t sStack_1af8;
  fdb_kvs_handle *pfStack_1af0;
  fdb_kvs_info fStack_1ae8;
  undefined1 auStack_1ab8 [14];
  undefined2 uStack_1aaa;
  undefined1 auStack_1aa8 [520];
  fdb_kvs_handle *pfStack_18a0;
  fdb_kvs_handle *pfStack_1898;
  fdb_kvs_handle *pfStack_1890;
  fdb_kvs_handle *pfStack_1888;
  fdb_kvs_handle *pfStack_1880;
  fdb_kvs_handle *pfStack_1878;
  undefined1 auStack_1868 [8];
  fdb_file_handle *pfStack_1860;
  fdb_kvs_handle *pfStack_1858;
  fdb_kvs_handle *pfStack_1850;
  fdb_iterator *pfStack_1848;
  undefined1 auStack_1840 [48];
  undefined1 auStack_1810 [64];
  hbtrie *phStack_17d0;
  kvs_ops_stat *pkStack_17c8;
  timeval tStack_17a0;
  btreeblk_handle *apbStack_1790 [33];
  undefined1 auStack_1688 [32];
  undefined2 uStack_1668;
  undefined1 uStack_1648;
  code *pcStack_1630;
  undefined4 uStack_1628;
  fdb_txn *pfStack_1620;
  fdb_kvs_handle *pfStack_1590;
  char acStack_1588 [256];
  fdb_kvs_handle *pfStack_1488;
  fdb_kvs_handle *pfStack_1480;
  fdb_kvs_handle *pfStack_1478;
  fdb_kvs_handle *pfStack_1470;
  fdb_kvs_handle *pfStack_1468;
  fdb_kvs_handle *pfStack_1460;
  fdb_kvs_handle *pfStack_1450;
  uint uStack_1444;
  fdb_iterator *pfStack_1440;
  fdb_kvs_handle *pfStack_1438;
  undefined4 *puStack_1430;
  fdb_kvs_handle *pfStack_1428;
  fdb_kvs_handle *pfStack_1420;
  fdb_iterator *pfStack_1418;
  fdb_file_handle *pfStack_1410;
  fdb_iterator *pfStack_1408;
  size_t sStack_1400;
  undefined1 auStack_13f8 [32];
  timeval tStack_13d8;
  undefined1 auStack_13c8 [272];
  size_t sStack_12b8;
  char *pcStack_12b0;
  uint8_t uStack_12a8;
  undefined2 uStack_12a0;
  undefined1 uStack_1280;
  fdb_kvs_handle *pfStack_11c8;
  char acStack_11c0 [256];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_10c0;
  fdb_kvs_handle *pfStack_10b8;
  fdb_kvs_handle *pfStack_10b0;
  fdb_kvs_handle *pfStack_10a8;
  fdb_kvs_handle *pfStack_10a0;
  fdb_kvs_handle *pfStack_1098;
  fdb_kvs_handle *pfStack_1088;
  fdb_file_handle *pfStack_1080;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1078;
  fdb_doc *pfStack_1070;
  fdb_kvs_handle *pfStack_1068;
  fdb_kvs_handle *pfStack_1060;
  fdb_kvs_handle *pfStack_1058;
  fdb_kvs_handle *pfStack_1050;
  fdb_kvs_handle *pfStack_1048;
  fdb_kvs_handle *pfStack_1040;
  fdb_kvs_config fStack_1038;
  fdb_kvs_config fStack_1020;
  fdb_kvs_config fStack_1000;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_fe0 [4];
  timeval tStack_fc0;
  fdb_config fStack_fb0;
  fdb_kvs_info *pfStack_e98;
  atomic<unsigned_long> aStack_e90;
  fdb_kvs_handle *pfStack_e88;
  atomic<unsigned_long> aStack_e80;
  fdb_kvs_handle *pfStack_e78;
  atomic<unsigned_long> aStack_e70;
  fdb_kvs_handle *pfStack_e60;
  fdb_kvs_handle *pfStack_e58;
  fdb_file_handle *pfStack_e50;
  undefined1 auStack_e48 [16];
  fdb_config *pfStack_e38;
  fdb_kvs_info fStack_e30;
  fdb_kvs_config fStack_e00;
  undefined1 auStack_de8 [176];
  char acStack_d38 [256];
  undefined1 auStack_c38 [512];
  fdb_config fStack_a38;
  fdb_kvs_handle *pfStack_940;
  fdb_kvs_handle *pfStack_938;
  fdb_kvs_handle *pfStack_930;
  fdb_kvs_handle *pfStack_928;
  fdb_kvs_handle *pfStack_920;
  fdb_kvs_handle *pfStack_918;
  fdb_kvs_handle *pfStack_910;
  fdb_kvs_handle *pfStack_908;
  fdb_kvs_handle *pfStack_900;
  fdb_kvs_handle *pfStack_8f8;
  fdb_file_handle *pfStack_8f0;
  undefined4 *puStack_8e8;
  undefined1 auStack_8e0 [48];
  fdb_kvs_handle *pfStack_8b0;
  undefined1 auStack_8a8 [40];
  undefined1 auStack_880 [272];
  size_t sStack_770;
  uint8_t uStack_760;
  undefined1 uStack_758;
  undefined1 uStack_738;
  fdb_kvs_handle *pfStack_680;
  char acStack_678 [256];
  hbtrie **pphStack_578;
  fdb_kvs_handle *pfStack_570;
  fdb_kvs_handle *pfStack_568;
  fdb_config *pfStack_560;
  fdb_kvs_handle *pfStack_558;
  fdb_kvs_handle *pfStack_550;
  fdb_kvs_handle *local_538;
  hbtrie *local_530;
  undefined1 local_528 [16];
  hbtrie **local_518;
  kvs_info *local_510 [3];
  hbtrie *local_4f8;
  timeval local_4f0;
  undefined1 local_4e0 [184];
  char local_428 [256];
  undefined1 local_328 [520];
  undefined8 local_120;
  undefined8 local_118;
  undefined4 local_104;
  undefined1 local_f9;
  
  pfStack_550 = (fdb_kvs_handle *)0x1112d1;
  gettimeofday(&local_4f0,(__timezone_ptr_t)0x0);
  pfStack_550 = (fdb_kvs_handle *)0x1112d6;
  memleak_start();
  pfStack_550 = (fdb_kvs_handle *)0x1112e5;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar8 = (fdb_config *)(local_328 + 0x200);
  pfStack_550 = (fdb_kvs_handle *)0x1112f5;
  fdb_get_default_config();
  pcVar19 = local_4e0;
  pfStack_550 = (fdb_kvs_handle *)0x111302;
  fdb_get_default_kvs_config();
  local_120 = 0;
  local_118 = 0x400;
  local_104 = 1;
  local_f9 = 0;
  pfStack_550 = (fdb_kvs_handle *)0x111327;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_550 = (fdb_kvs_handle *)0x11133e;
  fVar5 = fdb_open((fdb_file_handle **)&local_530,"./mvcc_test1",pfVar8);
  handle._M_i = (__int_type)(uint)fVar5;
  pfStack_550 = (fdb_kvs_handle *)0x111350;
  fdb_kvs_open_default((fdb_file_handle *)local_530,&local_538,(fdb_kvs_config *)pcVar19);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (char *)0x0;
    uVar17 = 0;
    do {
      pfStack_550 = (fdb_kvs_handle *)0x111378;
      sprintf(local_328 + 0x100,"key%d",uVar17 & 0xffffffff);
      pfStack_550 = (fdb_kvs_handle *)0x111390;
      sprintf(local_328,"meta%d",uVar17 & 0xffffffff);
      pfStack_550 = (fdb_kvs_handle *)0x1113a8;
      sprintf(local_428,"body%d",uVar17 & 0xffffffff);
      pcVar19 = local_4e0 + (long)unaff_R12 + 0x18;
      pfStack_550 = (fdb_kvs_handle *)0x1113bb;
      unaff_R13 = (char *)strlen(local_328 + 0x100);
      handle._M_i = (__int_type)local_328;
      pfStack_550 = (fdb_kvs_handle *)0x1113ce;
      pfVar8 = (fdb_config *)strlen((char *)handle._M_i);
      pfStack_550 = (fdb_kvs_handle *)0x1113de;
      sVar9 = strlen(local_428);
      pfStack_550 = (fdb_kvs_handle *)0x111403;
      in_RCX = (fdb_kvs_handle *)handle._M_i;
      fdb_doc_create((fdb_doc **)pcVar19,local_328 + 0x100,(size_t)unaff_R13,(void *)handle._M_i,
                     (size_t)pfVar8,local_428,sVar9);
      pfStack_550 = (fdb_kvs_handle *)0x111415;
      fdb_set(local_538,*(fdb_doc **)(local_4e0 + uVar17 * 8 + 0x18));
      pfStack_550 = (fdb_kvs_handle *)0x111422;
      fdb_doc_free(*(fdb_doc **)(local_4e0 + uVar17 * 8 + 0x18));
      uVar17 = uVar17 + 1;
      unaff_R12 = (char *)((long)unaff_R12 + 8);
    } while (uVar17 != 0x14);
    pfStack_550 = (fdb_kvs_handle *)0x111442;
    fdb_commit((fdb_file_handle *)local_530,'\x01');
    pfStack_550 = (fdb_kvs_handle *)0x111451;
    fVar5 = fdb_get_kvs_info(local_538,(fdb_kvs_info *)(local_528 + 8));
    seqnum = local_518;
    pphVar4 = (hbtrie **)0x14;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001115d6;
    pfStack_550 = (fdb_kvs_handle *)0x111476;
    fVar5 = fdb_set_log_callback(local_538,logCallbackFunc,"snapshot_stats_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001115db;
    pfStack_550 = (fdb_kvs_handle *)0x111490;
    fVar5 = fdb_snapshot_open(local_538,(fdb_kvs_handle **)local_528,(fdb_seqnum_t)seqnum);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001115e0;
    pfVar8 = (fdb_config *)&local_518;
    pfStack_550 = (fdb_kvs_handle *)0x1114af;
    fdb_get_kvs_info((fdb_kvs_handle *)local_528._0_8_,(fdb_kvs_info *)(local_528 + 8));
    if (local_518 != seqnum) {
      pfStack_550 = (fdb_kvs_handle *)0x1114c0;
      snapshot_stats_test();
    }
    unaff_R12 = (char *)local_510;
    if (local_510[0] != (kvs_info *)0x14) {
      pfStack_550 = (fdb_kvs_handle *)0x1114d4;
      snapshot_stats_test();
    }
    pcVar19 = (char *)&local_4f8;
    if (local_4f8 != local_530) {
      pfStack_550 = (fdb_kvs_handle *)0x1114f0;
      snapshot_stats_test();
    }
    unaff_R13 = local_528;
    pfStack_550 = (fdb_kvs_handle *)0x1114fe;
    fdb_kvs_close((fdb_kvs_handle *)local_528._0_8_);
    pfStack_550 = (fdb_kvs_handle *)0x111512;
    fVar5 = fdb_snapshot_open(local_538,(fdb_kvs_handle **)unaff_R13,0xffffffffffffffff);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_550 = (fdb_kvs_handle *)0x11152c;
      fdb_get_kvs_info((fdb_kvs_handle *)local_528._0_8_,(fdb_kvs_info *)(local_528 + 8));
      if (local_518 != seqnum) {
        pfStack_550 = (fdb_kvs_handle *)0x11153d;
        snapshot_stats_test();
      }
      if (local_510[0] != (kvs_info *)0x14) {
        pfStack_550 = (fdb_kvs_handle *)0x11154d;
        snapshot_stats_test();
      }
      if (local_4f8 != local_530) {
        pfStack_550 = (fdb_kvs_handle *)0x111566;
        snapshot_stats_test();
      }
      pfStack_550 = (fdb_kvs_handle *)0x111570;
      fdb_kvs_close((fdb_kvs_handle *)local_528._0_8_);
      pfStack_550 = (fdb_kvs_handle *)0x11157a;
      fdb_kvs_close(local_538);
      pfStack_550 = (fdb_kvs_handle *)0x111584;
      fdb_close((fdb_file_handle *)local_530);
      pfStack_550 = (fdb_kvs_handle *)0x111589;
      fdb_shutdown();
      pfStack_550 = (fdb_kvs_handle *)0x11158e;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (snapshot_stats_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_550 = (fdb_kvs_handle *)0x1115bf;
      fprintf(_stderr,pcVar19,"snapshot stats test");
      return;
    }
  }
  else {
    pfStack_550 = (fdb_kvs_handle *)0x1115d6;
    snapshot_stats_test();
    pphVar4 = &local_530;
LAB_001115d6:
    seqnum = pphVar4;
    pfStack_550 = (fdb_kvs_handle *)0x1115db;
    snapshot_stats_test();
LAB_001115db:
    pfStack_550 = (fdb_kvs_handle *)0x1115e0;
    snapshot_stats_test();
LAB_001115e0:
    pfStack_550 = (fdb_kvs_handle *)0x1115e5;
    snapshot_stats_test();
  }
  pfStack_550 = (fdb_kvs_handle *)snapshot_with_uncomitted_data_test;
  snapshot_stats_test();
  pfStack_918 = (fdb_kvs_handle *)0x11160a;
  pphStack_578 = seqnum;
  pfStack_570 = (fdb_kvs_handle *)unaff_R12;
  pfStack_568 = (fdb_kvs_handle *)unaff_R13;
  pfStack_560 = pfVar8;
  pfStack_558 = (fdb_kvs_handle *)pcVar19;
  pfStack_550 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)(auStack_8a8 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_680 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_678,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_918 = (fdb_kvs_handle *)0x111632;
  system((char *)&pfStack_680);
  pfStack_918 = (fdb_kvs_handle *)0x111637;
  memleak_start();
  pfStack_918 = (fdb_kvs_handle *)0x111641;
  pfVar10 = (fdb_kvs_handle *)malloc(0x20);
  pfStack_918 = (fdb_kvs_handle *)0x11164e;
  srand(0x4d2);
  pfVar14 = (fdb_kvs_handle *)(auStack_880 + 0x108);
  pfStack_918 = (fdb_kvs_handle *)0x11165e;
  fdb_get_default_config();
  uStack_758 = 1;
  uStack_760 = '\x01';
  uStack_738 = 1;
  sStack_770 = 0;
  pfStack_918 = (fdb_kvs_handle *)0x11167e;
  fdb_get_default_kvs_config();
  pfStack_918 = (fdb_kvs_handle *)0x111692;
  fVar5 = fdb_open(&pfStack_8f0,"./mvcc_test9",(fdb_config *)pfVar14);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b4a;
  in_RCX = (fdb_kvs_handle *)auStack_8a8;
  pfStack_918 = (fdb_kvs_handle *)0x1116b0;
  fVar5 = fdb_kvs_open(pfStack_8f0,&pfStack_900,(char *)0x0,(fdb_kvs_config *)in_RCX);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b4f;
  in_RCX = (fdb_kvs_handle *)auStack_8a8;
  pfStack_918 = (fdb_kvs_handle *)0x1116d3;
  fVar5 = fdb_kvs_open(pfStack_8f0,&pfStack_8f8,"db1",(fdb_kvs_config *)in_RCX);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b54;
  in_RCX = (fdb_kvs_handle *)auStack_8a8;
  pfStack_918 = (fdb_kvs_handle *)0x1116f6;
  fVar5 = fdb_kvs_open(pfStack_8f0,&pfStack_908,"db2",(fdb_kvs_config *)in_RCX);
  pcVar23 = (char *)pfVar14;
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b59;
  puStack_8e8 = (undefined4 *)((long)&pfVar10->kvs + 2);
  pcVar23 = "key%06d";
  pcVar19 = auStack_880;
  unaff_R12 = "value%d";
  handle._M_i = 0;
  do {
    pfStack_918 = (fdb_kvs_handle *)0x111731;
    sprintf(pcVar19,"key%06d",handle._M_i);
    *(undefined4 *)&pfVar10->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar10->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar10->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 6) = 0x78787878;
    *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 6) = 0x78787878;
    *(undefined2 *)(puStack_8e8 + 1) = 0x3e;
    *puStack_8e8 = 0x646e653c;
    pfStack_918 = (fdb_kvs_handle *)0x11175f;
    sprintf((char *)pfVar10,"value%d",handle._M_i);
    pfVar14 = pfStack_900;
    pfStack_918 = (fdb_kvs_handle *)0x11176c;
    sVar9 = strlen(pcVar19);
    pfStack_918 = (fdb_kvs_handle *)0x111784;
    in_RCX = pfVar10;
    fVar5 = fdb_set_kv(pfVar14,pcVar19,sVar9 + 1,pfVar10,0x20);
    pfVar21 = pfStack_8f8;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      pfStack_918 = (fdb_kvs_handle *)0x111b36;
      snapshot_with_uncomitted_data_test();
LAB_00111b36:
      unaff_R13 = (char *)pfVar14;
      pfStack_918 = (fdb_kvs_handle *)0x111b3b;
      snapshot_with_uncomitted_data_test();
LAB_00111b3b:
      pfStack_918 = (fdb_kvs_handle *)0x111b40;
      snapshot_with_uncomitted_data_test();
      goto LAB_00111b40;
    }
    pfStack_918 = (fdb_kvs_handle *)0x111799;
    sVar9 = strlen(pcVar19);
    pfStack_918 = (fdb_kvs_handle *)0x1117b1;
    in_RCX = pfVar10;
    fVar5 = fdb_set_kv(pfVar21,pcVar19,sVar9 + 1,pfVar10,0x20);
    unaff_R13 = (char *)pfStack_908;
    pfVar14 = pfVar21;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b36;
    pfStack_918 = (fdb_kvs_handle *)0x1117c6;
    sVar9 = strlen(pcVar19);
    pfStack_918 = (fdb_kvs_handle *)0x1117de;
    in_RCX = pfVar10;
    fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,pcVar19,sVar9 + 1,pfVar10,0x20);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b3b;
    uVar18 = (int)handle._M_i + 1;
    handle._M_i = (__int_type)uVar18;
  } while (uVar18 != 10);
  pfStack_918 = (fdb_kvs_handle *)0x111800;
  fVar5 = fdb_get_kvs_info(pfStack_900,(fdb_kvs_info *)auStack_8e0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b5e;
  pfStack_918 = (fdb_kvs_handle *)0x11181a;
  fVar5 = fdb_snapshot_open(pfStack_900,&pfStack_910,auStack_8e0._8_8_);
  if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111b63;
  pfStack_918 = (fdb_kvs_handle *)0x111831;
  fVar5 = fdb_get_kvs_info(pfStack_8f8,(fdb_kvs_info *)auStack_8e0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b68;
  pfStack_918 = (fdb_kvs_handle *)0x11184b;
  fVar5 = fdb_snapshot_open(pfStack_8f8,&pfStack_910,auStack_8e0._8_8_);
  if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111b6d;
  pfStack_918 = (fdb_kvs_handle *)0x111862;
  fVar5 = fdb_get_kvs_info(pfStack_908,(fdb_kvs_info *)auStack_8e0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b72;
  pfStack_918 = (fdb_kvs_handle *)0x11187c;
  fVar5 = fdb_snapshot_open(pfStack_908,&pfStack_910,auStack_8e0._8_8_);
  if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111b77;
  pfStack_918 = (fdb_kvs_handle *)0x111890;
  fVar5 = fdb_commit(pfStack_8f0,'\0');
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b7c;
  pfStack_918 = (fdb_kvs_handle *)0x1118a7;
  fVar5 = fdb_get_kvs_info(pfStack_8f8,(fdb_kvs_info *)auStack_8e0);
  pfVar14 = (fdb_kvs_handle *)auStack_8e0._8_8_;
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b81;
  pfStack_918 = (fdb_kvs_handle *)0x1118c2;
  fVar5 = fdb_get_kvs_info(pfStack_908,(fdb_kvs_info *)auStack_8e0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b86;
  pcVar19 = auStack_8e0 + 8;
  if (pfVar14 != (fdb_kvs_handle *)auStack_8e0._8_8_) {
    pfStack_918 = (fdb_kvs_handle *)0x1118df;
    snapshot_with_uncomitted_data_test();
  }
  pfStack_918 = (fdb_kvs_handle *)0x1118ee;
  fVar5 = fdb_get_kvs_info(pfStack_900,(fdb_kvs_info *)auStack_8e0);
  pcVar23 = (char *)pfVar14;
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b8b;
  if (pfVar14 != (fdb_kvs_handle *)auStack_8e0._8_8_) {
    pfStack_918 = (fdb_kvs_handle *)0x111908;
    snapshot_with_uncomitted_data_test();
  }
  pfStack_8b0 = pfVar14;
  pcVar19 = "key%06d";
  unaff_R12 = auStack_880;
  unaff_R13 = "value%d";
  handle._M_i = 0;
  do {
    pfStack_918 = (fdb_kvs_handle *)0x111934;
    sprintf(unaff_R12,"key%06d",handle._M_i);
    *(undefined4 *)&pfVar10->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar10->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar10->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 6) = 0x78787878;
    *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 2) = 0x78787878;
    *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 6) = 0x78787878;
    *(undefined2 *)(puStack_8e8 + 1) = 0x3e;
    *puStack_8e8 = 0x646e653c;
    pfStack_918 = (fdb_kvs_handle *)0x111962;
    sprintf((char *)pfVar10,"value%d",handle._M_i);
    pfVar14 = pfStack_900;
    pfStack_918 = (fdb_kvs_handle *)0x11196f;
    sVar9 = strlen(unaff_R12);
    pfStack_918 = (fdb_kvs_handle *)0x111987;
    in_RCX = pfVar10;
    fVar5 = fdb_set_kv(pfVar14,unaff_R12,sVar9 + 1,pfVar10,0x20);
    pcVar23 = (char *)pfStack_908;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b45;
    pfStack_918 = (fdb_kvs_handle *)0x11199c;
    sVar9 = strlen(unaff_R12);
    pfStack_918 = (fdb_kvs_handle *)0x1119b4;
    in_RCX = pfVar10;
    fVar5 = fdb_set_kv((fdb_kvs_handle *)pcVar23,unaff_R12,sVar9 + 1,pfVar10,0x20);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b40;
    uVar18 = (int)handle._M_i + 1;
    handle._M_i = (__int_type)uVar18;
  } while (uVar18 != 10);
  pfStack_918 = (fdb_kvs_handle *)0x1119d6;
  fVar5 = fdb_get_kvs_info(pfStack_8f8,(fdb_kvs_info *)auStack_8e0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b90;
  pfStack_918 = (fdb_kvs_handle *)0x1119f0;
  fVar5 = fdb_snapshot_open(pfStack_8f8,&pfStack_910,auStack_8e0._8_8_);
  pcVar23 = (char *)pfStack_8b0;
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b95;
  pfStack_918 = (fdb_kvs_handle *)0x111a06;
  fVar5 = fdb_kvs_close(pfStack_910);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b9a;
  pfStack_918 = (fdb_kvs_handle *)0x111a1d;
  fVar5 = fdb_get_kvs_info(pfStack_908,(fdb_kvs_info *)auStack_8e0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b9f;
  pfStack_918 = (fdb_kvs_handle *)0x111a37;
  fVar5 = fdb_snapshot_open(pfStack_908,&pfStack_910,auStack_8e0._8_8_);
  if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111ba4;
  pfStack_918 = (fdb_kvs_handle *)0x111a4f;
  fVar5 = fdb_snapshot_open(pfStack_908,&pfStack_910,(fdb_seqnum_t)pcVar23);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111ba9;
  pfStack_918 = (fdb_kvs_handle *)0x111a60;
  fVar5 = fdb_kvs_close(pfStack_910);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111bae;
  pfStack_918 = (fdb_kvs_handle *)0x111a77;
  fVar5 = fdb_get_kvs_info(pfStack_900,(fdb_kvs_info *)auStack_8e0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111bb3;
  pfStack_918 = (fdb_kvs_handle *)0x111a91;
  fVar5 = fdb_snapshot_open(pfStack_900,&pfStack_910,auStack_8e0._8_8_);
  if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111bb8;
  pfStack_918 = (fdb_kvs_handle *)0x111aa9;
  fVar5 = fdb_snapshot_open(pfStack_900,&pfStack_910,(fdb_seqnum_t)pcVar23);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111bbd;
  pfStack_918 = (fdb_kvs_handle *)0x111aba;
  fVar5 = fdb_kvs_close(pfStack_910);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111bc2;
  pfStack_918 = (fdb_kvs_handle *)0x111acc;
  fVar5 = fdb_close(pfStack_8f0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111bc7;
  pfStack_918 = (fdb_kvs_handle *)0x111ad9;
  fVar5 = fdb_shutdown();
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_918 = (fdb_kvs_handle *)0x111ae9;
    free(pfVar10);
    pfStack_918 = (fdb_kvs_handle *)0x111aee;
    memleak_end();
    pcVar19 = "%s PASSED\n";
    if (snapshot_with_uncomitted_data_test()::__test_pass != '\0') {
      pcVar19 = "%s FAILED\n";
    }
    pfStack_918 = (fdb_kvs_handle *)0x111b1f;
    fprintf(_stderr,pcVar19,"snapshot with uncomitted data in other KVS test");
    return;
  }
  goto LAB_00111bcc;
LAB_00113057:
  pfStack_1460 = (fdb_kvs_handle *)0x11305c;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfVar10 = (fdb_kvs_handle *)pcVar19;
LAB_0011305c:
  pfStack_1460 = (fdb_kvs_handle *)0x113061;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113061:
  pfStack_1460 = (fdb_kvs_handle *)0x113071;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113071:
  pfStack_1460 = (fdb_kvs_handle *)0x11307c;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011307c:
  pfStack_1460 = (fdb_kvs_handle *)0x11308c;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011308c:
  pcVar19 = (char *)pfVar10;
  pfStack_1460 = (fdb_kvs_handle *)0x113091;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113091:
  pfStack_1460 = (fdb_kvs_handle *)0x1130a1;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130a1:
  pfStack_1460 = (fdb_kvs_handle *)0x1130ac;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130ac:
  pfStack_1460 = (fdb_kvs_handle *)0x1130b7;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130b7:
  pfStack_1460 = (fdb_kvs_handle *)0x1130c7;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130c7:
  pfStack_1460 = (fdb_kvs_handle *)0x1130d2;
  in_memory_snapshot_on_dirty_hbtrie_test();
  goto LAB_001130d2;
LAB_00113614:
  pfStack_1878 = (fdb_kvs_handle *)0x113624;
  in_memory_snapshot_compaction_test();
LAB_00113624:
  pfStack_1878 = (fdb_kvs_handle *)0x11362f;
  in_memory_snapshot_compaction_test();
LAB_0011362f:
  pfStack_1878 = (fdb_kvs_handle *)0x11363f;
  in_memory_snapshot_compaction_test();
LAB_0011363f:
  pfStack_1878 = (fdb_kvs_handle *)0x11364a;
  in_memory_snapshot_compaction_test();
  goto LAB_0011364a;
LAB_00113ba0:
  pcStack_1b30 = (code *)0x113bb0;
  cb_inmem_snap();
LAB_00113bb0:
  pcStack_1b30 = (code *)0x113bc0;
  cb_inmem_snap();
LAB_00113bc0:
  pcStack_1b30 = (code *)0x113bd0;
  cb_inmem_snap();
LAB_00113bd0:
  _Var13._M_i = (__int_type)(auStack_1aa8 + 0x100);
  pfVar21 = (fdb_kvs_handle *)auStack_1aa8;
  pcStack_1b30 = (code *)0x113be0;
  cb_inmem_snap();
  goto LAB_00113be0;
LAB_00114672:
  pfStack_20a8 = (fdb_iterator *)0x11467d;
  snapshot_clone_test();
  pfVar16 = pfVar15;
LAB_0011467d:
  pfVar15 = pfVar16;
  pfStack_20a8 = (fdb_iterator *)0x114682;
  snapshot_clone_test();
LAB_00114682:
  pfStack_20a8 = (fdb_iterator *)0x11468d;
  snapshot_clone_test();
LAB_0011468d:
  pfVar10 = (fdb_kvs_handle *)&pfStack_2090;
  pfStack_20a8 = (fdb_iterator *)0x114698;
  snapshot_clone_test();
  goto LAB_00114698;
LAB_00111b40:
  pfStack_918 = (fdb_kvs_handle *)0x111b45;
  snapshot_with_uncomitted_data_test();
  pfVar14 = (fdb_kvs_handle *)pcVar23;
LAB_00111b45:
  pfStack_918 = (fdb_kvs_handle *)0x111b4a;
  snapshot_with_uncomitted_data_test();
LAB_00111b4a:
  pfStack_918 = (fdb_kvs_handle *)0x111b4f;
  snapshot_with_uncomitted_data_test();
LAB_00111b4f:
  pfStack_918 = (fdb_kvs_handle *)0x111b54;
  snapshot_with_uncomitted_data_test();
LAB_00111b54:
  pfStack_918 = (fdb_kvs_handle *)0x111b59;
  snapshot_with_uncomitted_data_test();
  pcVar23 = (char *)pfVar14;
LAB_00111b59:
  pfStack_918 = (fdb_kvs_handle *)0x111b5e;
  snapshot_with_uncomitted_data_test();
LAB_00111b5e:
  pfStack_918 = (fdb_kvs_handle *)0x111b63;
  snapshot_with_uncomitted_data_test();
LAB_00111b63:
  pfStack_918 = (fdb_kvs_handle *)0x111b68;
  snapshot_with_uncomitted_data_test();
LAB_00111b68:
  pfStack_918 = (fdb_kvs_handle *)0x111b6d;
  snapshot_with_uncomitted_data_test();
LAB_00111b6d:
  pfStack_918 = (fdb_kvs_handle *)0x111b72;
  snapshot_with_uncomitted_data_test();
LAB_00111b72:
  pfStack_918 = (fdb_kvs_handle *)0x111b77;
  snapshot_with_uncomitted_data_test();
LAB_00111b77:
  pfStack_918 = (fdb_kvs_handle *)0x111b7c;
  snapshot_with_uncomitted_data_test();
LAB_00111b7c:
  pfStack_918 = (fdb_kvs_handle *)0x111b81;
  snapshot_with_uncomitted_data_test();
LAB_00111b81:
  pfVar14 = (fdb_kvs_handle *)pcVar23;
  pfStack_918 = (fdb_kvs_handle *)0x111b86;
  snapshot_with_uncomitted_data_test();
LAB_00111b86:
  pfStack_918 = (fdb_kvs_handle *)0x111b8b;
  snapshot_with_uncomitted_data_test();
  pcVar23 = (char *)pfVar14;
LAB_00111b8b:
  pfStack_918 = (fdb_kvs_handle *)0x111b90;
  snapshot_with_uncomitted_data_test();
LAB_00111b90:
  pfStack_918 = (fdb_kvs_handle *)0x111b95;
  snapshot_with_uncomitted_data_test();
LAB_00111b95:
  pfStack_918 = (fdb_kvs_handle *)0x111b9a;
  snapshot_with_uncomitted_data_test();
LAB_00111b9a:
  pfStack_918 = (fdb_kvs_handle *)0x111b9f;
  snapshot_with_uncomitted_data_test();
LAB_00111b9f:
  pfStack_918 = (fdb_kvs_handle *)0x111ba4;
  snapshot_with_uncomitted_data_test();
LAB_00111ba4:
  pfStack_918 = (fdb_kvs_handle *)0x111ba9;
  snapshot_with_uncomitted_data_test();
LAB_00111ba9:
  pfStack_918 = (fdb_kvs_handle *)0x111bae;
  snapshot_with_uncomitted_data_test();
LAB_00111bae:
  pfStack_918 = (fdb_kvs_handle *)0x111bb3;
  snapshot_with_uncomitted_data_test();
LAB_00111bb3:
  pfStack_918 = (fdb_kvs_handle *)0x111bb8;
  snapshot_with_uncomitted_data_test();
LAB_00111bb8:
  pfStack_918 = (fdb_kvs_handle *)0x111bbd;
  snapshot_with_uncomitted_data_test();
LAB_00111bbd:
  pfStack_918 = (fdb_kvs_handle *)0x111bc2;
  snapshot_with_uncomitted_data_test();
LAB_00111bc2:
  pfStack_918 = (fdb_kvs_handle *)0x111bc7;
  snapshot_with_uncomitted_data_test();
LAB_00111bc7:
  pfStack_918 = (fdb_kvs_handle *)0x111bcc;
  snapshot_with_uncomitted_data_test();
LAB_00111bcc:
  pfStack_918 = (fdb_kvs_handle *)in_memory_snapshot_test;
  snapshot_with_uncomitted_data_test();
  aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bf1;
  pfStack_940 = pfVar10;
  pfStack_938 = (fdb_kvs_handle *)unaff_R12;
  pfStack_930 = (fdb_kvs_handle *)unaff_R13;
  pfStack_928 = (fdb_kvs_handle *)pcVar23;
  pfStack_920 = (fdb_kvs_handle *)pcVar19;
  pfStack_918 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)(auStack_de8 + 0xa0),(__timezone_ptr_t)0x0);
  aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bf6;
  memleak_start();
  pcVar23 = "rm -rf  mvcc_test* > errorlog.txt";
  aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c05;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar8 = &fStack_a38;
  aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c15;
  fdb_get_default_config();
  aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c1f;
  fdb_get_default_kvs_config();
  fStack_a38.buffercache_size = 0;
  fStack_a38.wal_threshold = 0x400;
  fStack_a38.flags = 1;
  fStack_a38.compaction_threshold = '\0';
  aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c44;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c58;
  fVar5 = fdb_open(&pfStack_e50,"./mvcc_test1",pfVar8);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c74;
    fVar5 = fdb_kvs_open_default(pfStack_e50,&pfStack_e60,&fStack_e00);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112359;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c8d;
    fVar5 = fdb_snapshot_open(pfStack_e60,&pfStack_e58,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011235e;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ca4;
    fdb_get_kvs_info(pfStack_e58,&fStack_e30);
    if ((fdb_config *)fStack_e30.last_seqnum != (fdb_config *)0x0) {
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cb4;
      in_memory_snapshot_test();
    }
    pcVar23 = auStack_e48;
    in_RCX = (fdb_kvs_handle *)0x0;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cd7;
    fdb_iterator_init(pfStack_e58,(fdb_iterator **)pcVar23,(void *)0x0,0,(void *)0x0,0,0);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ce4;
    fVar5 = fdb_iterator_get((fdb_iterator *)auStack_e48._0_8_,(fdb_doc **)(auStack_e48 + 8));
    _Var13._M_i = (__int_type)pfVar8;
    if (fVar5 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00112363;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cf7;
    fdb_iterator_close((fdb_iterator *)auStack_e48._0_8_);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d01;
    fdb_kvs_close(pfStack_e58);
    lVar22 = 0;
    uVar17 = 0;
    do {
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d23;
      sprintf(acStack_d38,"key%d",uVar17 & 0xffffffff);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d3f;
      sprintf(auStack_c38,"meta%d",uVar17 & 0xffffffff);
      pcVar19 = auStack_c38 + 0x100;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d5b;
      sprintf(pcVar19,"body%d",uVar17 & 0xffffffff);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d6e;
      sVar9 = strlen(acStack_d38);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d79;
      sVar11 = strlen(auStack_c38);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d84;
      sVar12 = strlen(pcVar19);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111da9;
      fdb_doc_create((fdb_doc **)(auStack_de8 + lVar22),acStack_d38,sVar9,auStack_c38,sVar11,pcVar19
                     ,sVar12);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111dbb;
      fdb_set(pfStack_e60,*(fdb_doc **)(auStack_de8 + uVar17 * 8));
      uVar17 = uVar17 + 1;
      lVar22 = lVar22 + 8;
    } while (uVar17 != 5);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ddb;
    fdb_commit(pfStack_e50,'\x01');
    uVar17 = 5;
    ppfVar24 = (fdb_doc **)(auStack_de8 + 0x28);
    do {
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e05;
      sprintf(acStack_d38,"key%d",uVar17 & 0xffffffff);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e21;
      sprintf(auStack_c38,"meta%d",uVar17 & 0xffffffff);
      pcVar19 = auStack_c38 + 0x100;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e3d;
      sprintf(pcVar19,"body%d",uVar17 & 0xffffffff);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e45;
      sVar9 = strlen(acStack_d38);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e50;
      sVar11 = strlen(auStack_c38);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e5b;
      sVar12 = strlen(pcVar19);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e7b;
      fdb_doc_create(ppfVar24,acStack_d38,sVar9,auStack_c38,sVar11,pcVar19,sVar12);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e88;
      fdb_set(pfStack_e60,*ppfVar24);
      uVar17 = uVar17 + 1;
      ppfVar24 = ppfVar24 + 1;
    } while (uVar17 != 9);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111eb7;
    sprintf(acStack_d38,"key%d",9);
    pcVar19 = auStack_c38;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ed5;
    sprintf(pcVar19,"meta%d",9);
    unaff_R12 = auStack_c38 + 0x100;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ef3;
    sprintf(unaff_R12,"Body%d",9);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f03;
    unaff_R13 = (char *)strlen(acStack_d38);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f0e;
    handle._M_i = strlen(pcVar19);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f19;
    sVar9 = strlen(unaff_R12);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f34;
    in_RCX = (fdb_kvs_handle *)pcVar19;
    fdb_doc_create((fdb_doc **)(auStack_de8 + 0x48),acStack_d38,(size_t)unaff_R13,pcVar19,
                   handle._M_i,unaff_R12,sVar9);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f41;
    fdb_set(pfStack_e60,(fdb_doc *)auStack_de8._72_8_);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f4d;
    fdb_commit(pfStack_e50,'\0');
    **(undefined1 **)(auStack_de8._72_8_ + 0x40) = 0x62;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f64;
    fdb_set(pfStack_e60,(fdb_doc *)auStack_de8._72_8_);
    _Var13._M_i = *(fdb_seqnum_t *)(auStack_de8._72_8_ + 0x28);
    pcVar23 = (char *)&fStack_e30;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f7d;
    fdb_get_kvs_info(pfStack_e60,(fdb_kvs_info *)pcVar23);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f90;
    fVar5 = fdb_snapshot_open(pfStack_e60,&pfStack_e58,fStack_e30.last_seqnum);
    if (fVar5 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_00112368;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fb4;
    pfStack_e38 = (fdb_config *)_Var13._M_i;
    fVar5 = fdb_snapshot_open(pfStack_e60,&pfStack_e58,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011236d;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fc8;
    fdb_commit(pfStack_e50,'\0');
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fda;
    fdb_set(pfStack_e60,(fdb_doc *)auStack_de8._72_8_);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fe6;
    fdb_commit(pfStack_e50,'\0');
    uVar17 = 10;
    pcVar23 = (char *)0x50;
    do {
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11200d;
      sprintf(acStack_d38,"key%d",uVar17 & 0xffffffff);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112029;
      sprintf(auStack_c38,"meta%d",uVar17 & 0xffffffff);
      unaff_R12 = auStack_c38 + 0x100;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112045;
      sprintf(unaff_R12,"body%d",uVar17 & 0xffffffff);
      handle._M_i = (__int_type)(auStack_de8 + (long)pcVar23);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112058;
      _Var13._M_i = strlen(acStack_d38);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112063;
      unaff_R13 = (char *)strlen(auStack_c38);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11206e;
      sVar9 = strlen(unaff_R12);
      in_RCX = (fdb_kvs_handle *)auStack_c38;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112093;
      fdb_doc_create((fdb_doc **)handle._M_i,acStack_d38,_Var13._M_i,in_RCX,(size_t)unaff_R13,
                     unaff_R12,sVar9);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120a5;
      fdb_set(pfStack_e60,*(fdb_doc **)(auStack_de8 + uVar17 * 8));
      uVar17 = uVar17 + 1;
      pcVar23 = (char *)((long)pcVar23 + 8);
    } while (uVar17 != 0xf);
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120ce;
    fVar5 = fdb_set_log_callback(pfStack_e60,logCallbackFunc,"in_memory_snapshot_test");
    pcVar19 = (char *)0xf;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112372;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120e8;
    fdb_get_kvs_info(pfStack_e58,&fStack_e30);
    if ((fdb_config *)fStack_e30.last_seqnum != pfStack_e38) {
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120fd;
      in_memory_snapshot_test();
    }
    uVar17 = 0xf;
    pfVar8 = (fdb_config *)(auStack_de8 + 0x78);
    do {
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112125;
      sprintf(acStack_d38,"key%d",uVar17 & 0xffffffff);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112140;
      sprintf(auStack_c38,"meta%d",uVar17 & 0xffffffff);
      handle._M_i = (__int_type)(auStack_c38 + 0x100);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11215b;
      sprintf((char *)handle._M_i,"body%d",uVar17 & 0xffffffff);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112163;
      pcVar19 = (char *)strlen(acStack_d38);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11216e;
      unaff_R12 = (char *)strlen(auStack_c38);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112179;
      sVar9 = strlen((char *)handle._M_i);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112199;
      fdb_doc_create((fdb_doc **)pfVar8,acStack_d38,(size_t)pcVar19,auStack_c38,(size_t)unaff_R12,
                     (void *)handle._M_i,sVar9);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121a6;
      fdb_set(pfStack_e60,*(fdb_doc **)pfVar8);
      uVar17 = uVar17 + 1;
      pfVar8 = (fdb_config *)((long)pfVar8 + 8);
    } while (uVar17 != 0x14);
    unaff_R13 = (char *)0x0;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121c6;
    fdb_commit(pfStack_e50,'\0');
    in_RCX = (fdb_kvs_handle *)0x0;
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121e6;
    fdb_iterator_init(pfStack_e58,(fdb_iterator **)auStack_e48,(void *)0x0,0,(void *)0x0,0,0);
    pcVar23 = auStack_e48 + 8;
    auStack_e48._8_8_ = (fdb_config *)0x0;
    do {
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121ff;
      fVar5 = fdb_iterator_get((fdb_iterator *)auStack_e48._0_8_,(fdb_doc **)pcVar23);
      _Var13._M_i = auStack_e48._8_8_;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_00112339:
        aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11233e;
        in_memory_snapshot_test();
LAB_0011233e:
        aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112349;
        in_memory_snapshot_test();
LAB_00112349:
        aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112354;
        in_memory_snapshot_test();
        goto LAB_00112354;
      }
      pcVar19 = *(char **)(auStack_e48._8_8_ + 0x20);
      handle._M_i = *(__int_type *)(auStack_de8 + (long)unaff_R13 * 8);
      unaff_R12 = (char *)((fdb_kvs_handle *)handle._M_i)->op_stats;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11222a;
      iVar6 = bcmp(pcVar19,unaff_R12,*(size_t *)auStack_e48._8_8_);
      pfVar8 = (fdb_config *)_Var13._M_i;
      if (iVar6 != 0) {
        aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112339;
        in_memory_snapshot_test();
        goto LAB_00112339;
      }
      pcVar19 = *(char **)(_Var13._M_i + 0x38);
      unaff_R12 = (char *)((fdb_kvs_handle *)handle._M_i)->staletree;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112249;
      iVar6 = bcmp(pcVar19,unaff_R12,*(uint64_t *)(_Var13._M_i + 8));
      if (iVar6 != 0) goto LAB_00112349;
      pcVar19 = *(char **)(_Var13._M_i + 0x40);
      unaff_R12 = (char *)(((fdb_kvs_handle *)handle._M_i)->field_6).seqtree;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112268;
      iVar6 = bcmp(pcVar19,unaff_R12,*(uint64_t *)(_Var13._M_i + 0x10));
      if (iVar6 != 0) goto LAB_0011233e;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112278;
      fdb_doc_free((fdb_doc *)_Var13._M_i);
      auStack_e48._8_8_ = (fdb_config *)0x0;
      unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11228e;
      fVar5 = fdb_iterator_next((fdb_iterator *)auStack_e48._0_8_);
    } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 == 10) {
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122ab;
      fdb_iterator_close((fdb_iterator *)auStack_e48._0_8_);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122b5;
      fdb_kvs_close(pfStack_e60);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122bf;
      fdb_kvs_close(pfStack_e58);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122c9;
      fdb_close(pfStack_e50);
      lVar22 = 0;
      do {
        aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122d8;
        fdb_doc_free(*(fdb_doc **)(auStack_de8 + lVar22 * 8));
        lVar22 = lVar22 + 1;
      } while (lVar22 != 0x14);
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122e6;
      fdb_shutdown();
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122eb;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (in_memory_snapshot_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11231c;
      fprintf(_stderr,pcVar19,"in-memory snapshot test");
      return;
    }
  }
  else {
LAB_00112354:
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112359;
    in_memory_snapshot_test();
LAB_00112359:
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11235e;
    in_memory_snapshot_test();
LAB_0011235e:
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112363;
    in_memory_snapshot_test();
    _Var13._M_i = (__int_type)pfVar8;
LAB_00112363:
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112368;
    in_memory_snapshot_test();
LAB_00112368:
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11236d;
    in_memory_snapshot_test();
LAB_0011236d:
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112372;
    in_memory_snapshot_test();
LAB_00112372:
    aStack_e70.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112377;
    in_memory_snapshot_test();
  }
  aStack_e70.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)in_memory_snapshot_cleanup_test;
  in_memory_snapshot_test();
  handle_00 = (char *)0x0;
  pfStack_1098 = (fdb_kvs_handle *)0x11239f;
  pfStack_e98 = (fdb_kvs_info *)pcVar23;
  aStack_e90.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)unaff_R12;
  pfStack_e88 = (fdb_kvs_handle *)unaff_R13;
  aStack_e80.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
  pfStack_e78 = (fdb_kvs_handle *)pcVar19;
  aStack_e70.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)handle._M_i;
  gettimeofday(&tStack_fc0,(__timezone_ptr_t)0x0);
  pfStack_1098 = (fdb_kvs_handle *)0x1123a4;
  memleak_start();
  aStack_1078.seqtree = (btree *)0x0;
  pcVar19 = "rm -rf  mvcc_test* > errorlog.txt";
  pfStack_1098 = (fdb_kvs_handle *)0x1123b8;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar14 = (fdb_kvs_handle *)&fStack_fb0.seqtree_opt;
  pfStack_1098 = (fdb_kvs_handle *)0x1123c8;
  fdb_get_default_config();
  pfStack_1098 = (fdb_kvs_handle *)0x1123d2;
  fdb_get_default_kvs_config();
  fStack_fb0.compaction_minimum_filesize = 0x400;
  fStack_fb0._68_4_ = 1;
  fStack_fb0.prefetch_duration._7_1_ = '\0';
  fStack_fb0.breakpad_minidump_dir = (char *)0x0;
  pfStack_1098 = (fdb_kvs_handle *)0x1123f6;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_1098 = (fdb_kvs_handle *)0x11240a;
  fVar5 = fdb_open(&pfStack_1080,"./mvcc_test1",(fdb_config *)pfVar14);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_1098 = (fdb_kvs_handle *)0x112426;
    fVar5 = fdb_kvs_open_default(pfStack_1080,&pfStack_1088,&fStack_1038);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127ba;
    pfStack_1098 = (fdb_kvs_handle *)0x112446;
    fVar5 = fdb_set_log_callback(pfStack_1088,logCallbackFunc,"in_memory_snapshot_cleanup_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127bf;
    pcVar19 = (char *)aaStack_fe0;
    aaStack_fe0[0]._0_4_ = 0x79656b;
    pfVar14 = (fdb_kvs_handle *)&fStack_1000;
    fStack_1000._4_1_ = 0;
    fStack_1000.create_if_missing = true;
    fStack_1000._1_3_ = 0x617465;
    handle_00 = &fStack_1020.create_if_missing;
    fStack_1020._4_1_ = 0;
    fStack_1020.create_if_missing = true;
    fStack_1020._1_3_ = 0x79646f;
    pfStack_1098 = (fdb_kvs_handle *)0x112489;
    unaff_R12 = (char *)strlen(pcVar19);
    pfStack_1098 = (fdb_kvs_handle *)0x112494;
    unaff_R13 = (char *)strlen((char *)pfVar14);
    pfStack_1098 = (fdb_kvs_handle *)0x11249f;
    sVar9 = strlen(handle_00);
    handle._M_i = (__int_type)&aStack_1078;
    pfStack_1098 = (fdb_kvs_handle *)0x1124bf;
    in_RCX = pfVar14;
    fdb_doc_create((fdb_doc **)handle._M_i,pcVar19,(size_t)unaff_R12,pfVar14,(size_t)unaff_R13,
                   handle_00,sVar9);
    pfStack_1098 = (fdb_kvs_handle *)0x1124cd;
    fdb_set(pfStack_1088,(fdb_doc *)aStack_1078.seqtree);
    pfStack_1098 = (fdb_kvs_handle *)0x1124d9;
    fdb_commit(pfStack_1080,'\0');
    pfStack_1098 = (fdb_kvs_handle *)0x1124ef;
    fVar5 = fdb_snapshot_open(pfStack_1088,&pfStack_1058,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127c4;
    pfStack_1098 = (fdb_kvs_handle *)0x112506;
    fVar5 = fdb_set(pfStack_1088,(fdb_doc *)aStack_1078.seqtree);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127c9;
    pfStack_1098 = (fdb_kvs_handle *)0x11251a;
    fVar5 = fdb_commit(pfStack_1080,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127ce;
    pfStack_1098 = (fdb_kvs_handle *)0x112538;
    fVar5 = fdb_snapshot_open(pfStack_1088,&pfStack_1060,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127d3;
    pfStack_1098 = (fdb_kvs_handle *)0x11254f;
    fVar5 = fdb_set(pfStack_1088,(fdb_doc *)aStack_1078.seqtree);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127d8;
    pfStack_1098 = (fdb_kvs_handle *)0x112563;
    fVar5 = fdb_commit(pfStack_1080,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127dd;
    pfStack_1098 = (fdb_kvs_handle *)0x11257a;
    fVar5 = fdb_set(pfStack_1088,(fdb_doc *)aStack_1078.seqtree);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127e2;
    pfStack_1098 = (fdb_kvs_handle *)0x11258e;
    fVar5 = fdb_commit(pfStack_1080,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127e7;
    pcVar19 = (char *)&aStack_1078;
    pfStack_1098 = (fdb_kvs_handle *)0x1125a3;
    fdb_doc_free((fdb_doc *)aStack_1078.seqtree);
    pfVar14 = (fdb_kvs_handle *)&fStack_fb0;
    fStack_fb0.chunksize = 0x654b;
    fStack_fb0._2_2_ = 0x79;
    pfStack_1098 = (fdb_kvs_handle *)0x1125ba;
    handle_00 = (char *)strlen((char *)pfVar14);
    unaff_R12 = &fStack_1000.create_if_missing;
    pfStack_1098 = (fdb_kvs_handle *)0x1125cd;
    unaff_R13 = (char *)strlen(unaff_R12);
    handle._M_i = (__int_type)&fStack_1020;
    pfStack_1098 = (fdb_kvs_handle *)0x1125dd;
    sVar9 = strlen((char *)handle._M_i);
    pfStack_1098 = (fdb_kvs_handle *)0x1125f8;
    in_RCX = (fdb_kvs_handle *)unaff_R12;
    fdb_doc_create((fdb_doc **)pcVar19,pfVar14,(size_t)handle_00,unaff_R12,(size_t)unaff_R13,
                   (void *)handle._M_i,sVar9);
    pfStack_1098 = (fdb_kvs_handle *)0x112605;
    fdb_set(pfStack_1088,(fdb_doc *)aStack_1078.seqtree);
    pfStack_1098 = (fdb_kvs_handle *)0x11261b;
    fVar5 = fdb_snapshot_open(pfStack_1088,&pfStack_1068,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127ec;
    pcVar19 = (char *)aaStack_fe0;
    pfStack_1098 = (fdb_kvs_handle *)0x112633;
    sVar9 = strlen(pcVar19);
    pfVar14 = (fdb_kvs_handle *)&pfStack_1070;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_1098 = (fdb_kvs_handle *)0x112656;
    fdb_doc_create((fdb_doc **)pfVar14,pcVar19,sVar9,(void *)0x0,0,(void *)0x0,0);
    pfStack_1098 = (fdb_kvs_handle *)0x112663;
    fVar5 = fdb_get(pfStack_1058,pfStack_1070);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127f1;
    pfStack_1098 = (fdb_kvs_handle *)0x11267a;
    fVar5 = fdb_get(pfStack_1060,pfStack_1070);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127f6;
    pfStack_1098 = (fdb_kvs_handle *)0x112691;
    fVar5 = fdb_get(pfStack_1068,pfStack_1070);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127fb;
    pfStack_1098 = (fdb_kvs_handle *)0x1126a3;
    fdb_doc_free(pfStack_1070);
    pfStack_1098 = (fdb_kvs_handle *)0x1126b7;
    fVar5 = fdb_snapshot_open(pfStack_1088,&pfStack_1040,1);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112800;
    pfStack_1098 = (fdb_kvs_handle *)0x1126d3;
    fVar5 = fdb_snapshot_open(pfStack_1088,&pfStack_1048,2);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112805;
    pfStack_1098 = (fdb_kvs_handle *)0x1126ef;
    fVar5 = fdb_snapshot_open(pfStack_1088,&pfStack_1050,3);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011280a;
    pfStack_1098 = (fdb_kvs_handle *)0x112701;
    fdb_kvs_close(pfStack_1058);
    pfStack_1098 = (fdb_kvs_handle *)0x11270b;
    fdb_kvs_close(pfStack_1060);
    pfStack_1098 = (fdb_kvs_handle *)0x112715;
    fdb_kvs_close(pfStack_1068);
    pfStack_1098 = (fdb_kvs_handle *)0x112724;
    fVar5 = fdb_commit(pfStack_1080,'\x01');
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_1098 = (fdb_kvs_handle *)0x112736;
      fdb_kvs_close(pfStack_1040);
      pfStack_1098 = (fdb_kvs_handle *)0x112740;
      fdb_kvs_close(pfStack_1048);
      pfStack_1098 = (fdb_kvs_handle *)0x11274a;
      fdb_kvs_close(pfStack_1050);
      pfStack_1098 = (fdb_kvs_handle *)0x112754;
      fdb_kvs_close(pfStack_1088);
      pfStack_1098 = (fdb_kvs_handle *)0x11275e;
      fdb_close(pfStack_1080);
      pfStack_1098 = (fdb_kvs_handle *)0x112768;
      fdb_doc_free((fdb_doc *)aStack_1078.seqtree);
      pfStack_1098 = (fdb_kvs_handle *)0x11276d;
      fdb_shutdown();
      pfStack_1098 = (fdb_kvs_handle *)0x112772;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (in_memory_snapshot_cleanup_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_1098 = (fdb_kvs_handle *)0x1127a3;
      fprintf(_stderr,pcVar19,"in-memory snapshot cleanup test");
      return;
    }
  }
  else {
    pfStack_1098 = (fdb_kvs_handle *)0x1127ba;
    in_memory_snapshot_cleanup_test();
LAB_001127ba:
    pfStack_1098 = (fdb_kvs_handle *)0x1127bf;
    in_memory_snapshot_cleanup_test();
LAB_001127bf:
    pfStack_1098 = (fdb_kvs_handle *)0x1127c4;
    in_memory_snapshot_cleanup_test();
LAB_001127c4:
    pfStack_1098 = (fdb_kvs_handle *)0x1127c9;
    in_memory_snapshot_cleanup_test();
LAB_001127c9:
    pfStack_1098 = (fdb_kvs_handle *)0x1127ce;
    in_memory_snapshot_cleanup_test();
LAB_001127ce:
    pfStack_1098 = (fdb_kvs_handle *)0x1127d3;
    in_memory_snapshot_cleanup_test();
LAB_001127d3:
    pfStack_1098 = (fdb_kvs_handle *)0x1127d8;
    in_memory_snapshot_cleanup_test();
LAB_001127d8:
    pfStack_1098 = (fdb_kvs_handle *)0x1127dd;
    in_memory_snapshot_cleanup_test();
LAB_001127dd:
    pfStack_1098 = (fdb_kvs_handle *)0x1127e2;
    in_memory_snapshot_cleanup_test();
LAB_001127e2:
    pfStack_1098 = (fdb_kvs_handle *)0x1127e7;
    in_memory_snapshot_cleanup_test();
LAB_001127e7:
    pfStack_1098 = (fdb_kvs_handle *)0x1127ec;
    in_memory_snapshot_cleanup_test();
LAB_001127ec:
    pfStack_1098 = (fdb_kvs_handle *)0x1127f1;
    in_memory_snapshot_cleanup_test();
LAB_001127f1:
    pfStack_1098 = (fdb_kvs_handle *)0x1127f6;
    in_memory_snapshot_cleanup_test();
LAB_001127f6:
    pfStack_1098 = (fdb_kvs_handle *)0x1127fb;
    in_memory_snapshot_cleanup_test();
LAB_001127fb:
    pfStack_1098 = (fdb_kvs_handle *)0x112800;
    in_memory_snapshot_cleanup_test();
LAB_00112800:
    pfStack_1098 = (fdb_kvs_handle *)0x112805;
    in_memory_snapshot_cleanup_test();
LAB_00112805:
    pfStack_1098 = (fdb_kvs_handle *)0x11280a;
    in_memory_snapshot_cleanup_test();
LAB_0011280a:
    pfStack_1098 = (fdb_kvs_handle *)0x11280f;
    in_memory_snapshot_cleanup_test();
  }
  pfStack_1098 = (fdb_kvs_handle *)in_memory_snapshot_on_dirty_hbtrie_test;
  in_memory_snapshot_cleanup_test();
  pfStack_1460 = (fdb_kvs_handle *)0x112834;
  paStack_10c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pcVar19;
  pfStack_10b8 = (fdb_kvs_handle *)unaff_R12;
  pfStack_10b0 = (fdb_kvs_handle *)unaff_R13;
  pfStack_10a8 = pfVar14;
  pfStack_10a0 = (fdb_kvs_handle *)handle_00;
  pfStack_1098 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday(&tStack_13d8,(__timezone_ptr_t)0x0);
  pfStack_11c8 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_11c0,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_1460 = (fdb_kvs_handle *)0x11285c;
  system((char *)&pfStack_11c8);
  pfStack_1460 = (fdb_kvs_handle *)0x112861;
  memleak_start();
  pfStack_1460 = (fdb_kvs_handle *)0x11286b;
  pfVar14 = (fdb_kvs_handle *)malloc(0x20);
  pcVar19 = auStack_13c8 + 0x108;
  pfStack_1460 = (fdb_kvs_handle *)0x11287e;
  fdb_get_default_config();
  uStack_12a0._0_1_ = true;
  uStack_12a0._1_1_ = true;
  uStack_12a8 = '\x01';
  pcStack_12b0 = (char *)0x3c;
  uStack_1280 = 1;
  sStack_12b8 = 0;
  pfStack_1460 = (fdb_kvs_handle *)0x1128a9;
  fdb_get_default_kvs_config();
  pfStack_1460 = (fdb_kvs_handle *)0x1128bd;
  fVar5 = fdb_open(&pfStack_1410,"./mvcc_test",(fdb_config *)pcVar19);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    in_RCX = (fdb_kvs_handle *)(auStack_13f8 + 8);
    pfStack_1460 = (fdb_kvs_handle *)0x1128e0;
    fVar5 = fdb_kvs_open(pfStack_1410,&pfStack_1428,"db",(fdb_kvs_config *)in_RCX);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130d7;
    puStack_1430 = (undefined4 *)((long)&pfVar14->kvs + 2);
    pcVar19 = "k%05d";
    handle_00 = auStack_13c8;
    unaff_R12 = "value%08d";
    handle._M_i = 0;
    do {
      pfStack_1460 = (fdb_kvs_handle *)0x11291b;
      sprintf(handle_00,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar14->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)(puStack_1430 + 1) = 0x3e;
      *puStack_1430 = 0x646e653c;
      pfStack_1460 = (fdb_kvs_handle *)0x112949;
      sprintf((char *)pfVar14,"value%08d",handle._M_i);
      unaff_R13 = (char *)pfStack_1428;
      pfStack_1460 = (fdb_kvs_handle *)0x112956;
      sVar9 = strlen(handle_00);
      pfStack_1460 = (fdb_kvs_handle *)0x11296e;
      in_RCX = pfVar14;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle_00,sVar9 + 1,pfVar14,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113057;
      uVar18 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar18;
    } while (uVar18 != 0x1e);
    pfStack_1460 = (fdb_kvs_handle *)0x11298c;
    fVar5 = fdb_commit(pfStack_1410,'\x01');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130dc;
    pfStack_1460 = (fdb_kvs_handle *)0x1129aa;
    fVar5 = fdb_snapshot_open(pfStack_1428,&pfStack_1438,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130e1;
    pfStack_1460 = (fdb_kvs_handle *)0x1129c8;
    fVar5 = fdb_snapshot_open(pfStack_1438,&pfStack_1420,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130e6;
    handle._M_i = 0x1e;
    handle_00 = auStack_13c8;
    unaff_R12 = "value%08d";
    do {
      pfStack_1460 = (fdb_kvs_handle *)0x1129fa;
      sprintf(handle_00,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar14->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)(puStack_1430 + 1) = 0x3e;
      *puStack_1430 = 0x646e653c;
      pfStack_1460 = (fdb_kvs_handle *)0x112a28;
      sprintf((char *)pfVar14,"value%08d",handle._M_i);
      unaff_R13 = (char *)pfStack_1428;
      pfStack_1460 = (fdb_kvs_handle *)0x112a35;
      sVar9 = strlen(handle_00);
      pfStack_1460 = (fdb_kvs_handle *)0x112a4d;
      in_RCX = pfVar14;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle_00,sVar9 + 1,pfVar14,0x20);
      pfVar10 = (fdb_kvs_handle *)"k%05d";
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011305c;
      uVar18 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar18;
    } while (uVar18 != 300);
    pfStack_1460 = (fdb_kvs_handle *)0x112a7d;
    sprintf((char *)auStack_13c8,"k%05d",0x1e);
    handle_00 = (char *)pfStack_1438;
    pfStack_1460 = (fdb_kvs_handle *)0x112a8a;
    sVar9 = strlen((char *)auStack_13c8);
    in_RCX = (fdb_kvs_handle *)auStack_13f8;
    pfStack_1460 = (fdb_kvs_handle *)0x112aa3;
    fVar5 = fdb_get_kv((fdb_kvs_handle *)handle_00,(fdb_kvs_handle *)auStack_13c8,sVar9 + 1,
                       (void **)in_RCX,&sStack_1400);
    pfVar10 = pfStack_1420;
    pcVar19 = (char *)auStack_13c8;
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_001130eb;
    handle_00 = auStack_13c8;
    pfStack_1460 = (fdb_kvs_handle *)0x112ac0;
    sVar9 = strlen(handle_00);
    in_RCX = (fdb_kvs_handle *)auStack_13f8;
    pfStack_1460 = (fdb_kvs_handle *)0x112ad9;
    fVar5 = fdb_get_kv(pfVar10,handle_00,sVar9 + 1,(void **)in_RCX,&sStack_1400);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_001130f0;
    pfStack_1460 = (fdb_kvs_handle *)0x112aeb;
    fVar5 = fdb_kvs_close(pfStack_1438);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130f5;
    pfStack_1460 = (fdb_kvs_handle *)0x112afd;
    fVar5 = fdb_kvs_close(pfStack_1420);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130fa;
    pfStack_1460 = (fdb_kvs_handle *)0x112b1b;
    fVar5 = fdb_snapshot_open(pfStack_1428,&pfStack_1438,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130ff;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_1460 = (fdb_kvs_handle *)0x112b43;
    fVar5 = fdb_iterator_init(pfStack_1438,&pfStack_1440,(void *)0x0,0,(void *)0x0,0,0);
    pcVar19 = (char *)pfVar10;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113104;
    unaff_R12 = auStack_13c8;
    unaff_R13 = "value%08d";
    handle._M_i = 0;
    do {
      pfStack_1450 = (fdb_kvs_handle *)0x0;
      pfStack_1460 = (fdb_kvs_handle *)0x112b74;
      fVar5 = fdb_iterator_get(pfStack_1440,(fdb_doc **)&pfStack_1450);
      pcVar19 = (char *)pfVar10;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      pfStack_1460 = (fdb_kvs_handle *)0x112b8f;
      sprintf(unaff_R12,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar14->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)(puStack_1430 + 1) = 0x3e;
      *puStack_1430 = 0x646e653c;
      pfStack_1460 = (fdb_kvs_handle *)0x112bbd;
      sprintf((char *)pfVar14,"value%08d",handle._M_i);
      pfVar10 = pfStack_1450;
      handle_00 = (char *)pfStack_1450->op_stats;
      pfStack_1460 = (fdb_kvs_handle *)0x112bd4;
      iVar6 = bcmp(handle_00,unaff_R12,*(size_t *)&pfStack_1450->kvs_config);
      if (iVar6 != 0) goto LAB_00113061;
      handle_00 = (char *)(pfVar10->field_6).seqtree;
      pfStack_1460 = (fdb_kvs_handle *)0x112bef;
      iVar6 = bcmp(handle_00,pfVar14,(size_t)(pfVar10->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_00113071;
      handle._M_i = (__int_type)((int)handle._M_i + 1);
      pfStack_1460 = (fdb_kvs_handle *)0x112c01;
      fdb_doc_free((fdb_doc *)pfVar10);
      pfStack_1460 = (fdb_kvs_handle *)0x112c0b;
      fVar5 = fdb_iterator_next(pfStack_1440);
      pcVar19 = (char *)pfVar10;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)handle._M_i != 300) goto LAB_00113109;
    pfStack_1460 = (fdb_kvs_handle *)0x112c29;
    fVar5 = fdb_iterator_close(pfStack_1440);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011310e;
    pfStack_1460 = (fdb_kvs_handle *)0x112c47;
    fVar5 = fdb_snapshot_open(pfStack_1438,&pfStack_1420,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113113;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_1460 = (fdb_kvs_handle *)0x112c6f;
    fVar5 = fdb_iterator_init(pfStack_1438,&pfStack_1440,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113118;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_1460 = (fdb_kvs_handle *)0x112c97;
    fVar5 = fdb_iterator_init(pfStack_1420,&pfStack_1408,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011311d;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_1460 = (fdb_kvs_handle *)0x112cbf;
    fVar5 = fdb_iterator_init(pfStack_1428,&pfStack_1418,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113122;
    unaff_R12 = auStack_13c8;
    unaff_R13 = "value%08d";
    handle_00 = "k%06d";
    uStack_1444 = 0;
    do {
      pfStack_1450 = (fdb_kvs_handle *)0x0;
      pfStack_1460 = (fdb_kvs_handle *)0x112cfd;
      fVar5 = fdb_iterator_get(pfStack_1440,(fdb_doc **)&pfStack_1450);
      uVar18 = uStack_1444;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112ea7;
      pfStack_1460 = (fdb_kvs_handle *)0x112d1c;
      sprintf(unaff_R12,"k%05d",(ulong)uStack_1444);
      *(undefined4 *)&pfVar14->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar14->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)(puStack_1430 + 1) = 0x3e;
      *puStack_1430 = 0x646e653c;
      pfStack_1460 = (fdb_kvs_handle *)0x112d4a;
      sprintf((char *)pfVar14,"value%08d",(ulong)uVar18);
      pfVar10 = pfStack_1450;
      handle._M_i = (__int_type)pfStack_1450->op_stats;
      pfStack_1460 = (fdb_kvs_handle *)0x112d61;
      iVar6 = bcmp((void *)handle._M_i,unaff_R12,*(size_t *)&pfStack_1450->kvs_config);
      if (iVar6 != 0) goto LAB_0011307c;
      handle._M_i = (__int_type)(pfVar10->field_6).seqtree;
      pfStack_1460 = (fdb_kvs_handle *)0x112d7c;
      iVar6 = bcmp((void *)handle._M_i,pfVar14,(size_t)(pfVar10->kvs_config).custom_cmp_param);
      pcVar19 = (char *)pfVar10;
      if (iVar6 != 0) goto LAB_001130ac;
      pfStack_1460 = (fdb_kvs_handle *)0x112d8c;
      fdb_doc_free((fdb_doc *)pfVar10);
      pfStack_1450 = (fdb_kvs_handle *)0x0;
      pfStack_1460 = (fdb_kvs_handle *)0x112da4;
      fVar5 = fdb_iterator_get(pfStack_1440,(fdb_doc **)&pfStack_1450);
      pcVar19 = (char *)pfStack_1450;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011308c;
      handle._M_i = (__int_type)pfStack_1450->op_stats;
      pfStack_1460 = (fdb_kvs_handle *)0x112dc3;
      iVar6 = bcmp((void *)handle._M_i,unaff_R12,*(size_t *)&pfStack_1450->kvs_config);
      if (iVar6 != 0) goto LAB_00113091;
      handle._M_i = (__int_type)(((fdb_kvs_handle *)pcVar19)->field_6).seqtree;
      pfStack_1460 = (fdb_kvs_handle *)0x112dde;
      iVar6 = bcmp((void *)handle._M_i,pfVar14,
                   (size_t)(((fdb_kvs_handle *)pcVar19)->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_001130a1;
      uVar18 = uStack_1444 + 1;
      pfStack_1460 = (fdb_kvs_handle *)0x112df4;
      fdb_doc_free((fdb_doc *)pcVar19);
      uStack_1444 = uVar18;
      if (uVar18 == 0x3c) {
        pcVar19 = (char *)0x0;
        do {
          pfStack_1460 = (fdb_kvs_handle *)0x112e10;
          sprintf(unaff_R12,"k%06d",pcVar19);
          *(undefined4 *)&pfVar14->kvs_config = 0x78787878;
          *(undefined4 *)&(pfVar14->kvs_config).field_0x4 = 0x78787878;
          *(undefined4 *)&(pfVar14->kvs_config).custom_cmp = 0x78787878;
          *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 4) = 0x78787878;
          *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 2) = 0x78787878;
          *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 6) = 0x78787878;
          *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 2) = 0x78787878;
          *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 6) = 0x78787878;
          *(undefined2 *)(puStack_1430 + 1) = 0x3e;
          *puStack_1430 = 0x646e653c;
          pfStack_1460 = (fdb_kvs_handle *)0x112e3f;
          sprintf((char *)pfVar14,"value%08d",pcVar19);
          handle._M_i = (__int_type)pfStack_1428;
          pfStack_1460 = (fdb_kvs_handle *)0x112e4c;
          sVar9 = strlen(unaff_R12);
          pfStack_1460 = (fdb_kvs_handle *)0x112e64;
          in_RCX = pfVar14;
          fVar5 = fdb_set_kv((fdb_kvs_handle *)handle._M_i,unaff_R12,sVar9 + 1,pfVar14,0x20);
          if (fVar5 != FDB_RESULT_SUCCESS) {
            pfStack_1460 = (fdb_kvs_handle *)0x113057;
            in_memory_snapshot_on_dirty_hbtrie_test();
            goto LAB_00113057;
          }
          uVar18 = (int)pcVar19 + 1;
          pcVar19 = (char *)(ulong)uVar18;
        } while (uVar18 != 3000);
      }
      pfStack_1460 = (fdb_kvs_handle *)0x112e82;
      fVar7 = fdb_iterator_next(pfStack_1440);
      handle._M_i = (__int_type)(uint)fVar7;
      pfStack_1460 = (fdb_kvs_handle *)0x112e8e;
      fVar5 = fdb_iterator_next(pfStack_1408);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00112e9f;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    pfStack_1460 = (fdb_kvs_handle *)0x112e9f;
    in_memory_snapshot_on_dirty_hbtrie_test();
    fVar5 = extraout_EAX;
LAB_00112e9f:
    if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_00112ea7:
      if (uStack_1444 != 300) goto LAB_00113127;
      pfStack_1460 = (fdb_kvs_handle *)0x112ebf;
      fVar5 = fdb_iterator_close(pfStack_1440);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011312c;
      pfStack_1460 = (fdb_kvs_handle *)0x112ed1;
      fVar5 = fdb_iterator_close(pfStack_1408);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113131;
      unaff_R12 = auStack_13c8;
      unaff_R13 = "value%08d";
      handle._M_i = 0;
      do {
        pfStack_1450 = (fdb_kvs_handle *)0x0;
        pfStack_1460 = (fdb_kvs_handle *)0x112f02;
        fVar5 = fdb_iterator_get(pfStack_1418,(fdb_doc **)&pfStack_1450);
        if (fVar5 != FDB_RESULT_SUCCESS) break;
        pfStack_1460 = (fdb_kvs_handle *)0x112f1d;
        sprintf(unaff_R12,"k%05d",handle._M_i);
        *(undefined4 *)&pfVar14->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar14->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar14->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp + 6) = 0x78787878;
        *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar14->kvs_config).custom_cmp_param + 6) = 0x78787878;
        *(undefined2 *)(puStack_1430 + 1) = 0x3e;
        *puStack_1430 = 0x646e653c;
        pfStack_1460 = (fdb_kvs_handle *)0x112f4b;
        sprintf((char *)pfVar14,"value%08d",handle._M_i);
        pcVar19 = (char *)pfStack_1450;
        handle_00 = (char *)pfStack_1450->op_stats;
        pfStack_1460 = (fdb_kvs_handle *)0x112f62;
        iVar6 = bcmp(handle_00,unaff_R12,*(size_t *)&pfStack_1450->kvs_config);
        if (iVar6 != 0) goto LAB_001130b7;
        handle_00 = (char *)(((fdb_kvs_handle *)pcVar19)->field_6).seqtree;
        pfStack_1460 = (fdb_kvs_handle *)0x112f7d;
        iVar6 = bcmp(handle_00,pfVar14,
                     (size_t)(((fdb_kvs_handle *)pcVar19)->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_001130c7;
        handle._M_i = (__int_type)((int)handle._M_i + 1);
        pfStack_1460 = (fdb_kvs_handle *)0x112f8f;
        fdb_doc_free((fdb_doc *)pcVar19);
        pfStack_1460 = (fdb_kvs_handle *)0x112f99;
        fVar5 = fdb_iterator_next(pfStack_1418);
      } while (fVar5 == FDB_RESULT_SUCCESS);
      if ((int)handle._M_i != 300) goto LAB_00113136;
      pfStack_1460 = (fdb_kvs_handle *)0x112fb7;
      fVar5 = fdb_iterator_close(pfStack_1418);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011313b;
      pfStack_1460 = (fdb_kvs_handle *)0x112fc9;
      fVar5 = fdb_kvs_close(pfStack_1438);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113140;
      pfStack_1460 = (fdb_kvs_handle *)0x112fdb;
      fVar5 = fdb_kvs_close(pfStack_1420);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113145;
      pfStack_1460 = (fdb_kvs_handle *)0x112fed;
      fVar5 = fdb_close(pfStack_1410);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011314a;
      pfStack_1460 = (fdb_kvs_handle *)0x112ffa;
      fVar5 = fdb_shutdown();
      if (fVar5 == FDB_RESULT_SUCCESS) {
        pfStack_1460 = (fdb_kvs_handle *)0x11300a;
        free(pfVar14);
        pfStack_1460 = (fdb_kvs_handle *)0x11300f;
        memleak_end();
        pcVar19 = "%s PASSED\n";
        if (in_memory_snapshot_on_dirty_hbtrie_test()::__test_pass != '\0') {
          pcVar19 = "%s FAILED\n";
        }
        pfStack_1460 = (fdb_kvs_handle *)0x113040;
        fprintf(_stderr,pcVar19,"in-memory snapshot on dirty HB+trie nodes test");
        return;
      }
      goto LAB_0011314f;
    }
  }
  else {
LAB_001130d2:
    pfStack_1460 = (fdb_kvs_handle *)0x1130d7;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130d7:
    pfStack_1460 = (fdb_kvs_handle *)0x1130dc;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130dc:
    pfStack_1460 = (fdb_kvs_handle *)0x1130e1;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130e1:
    pfStack_1460 = (fdb_kvs_handle *)0x1130e6;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130e6:
    pfStack_1460 = (fdb_kvs_handle *)0x1130eb;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130eb:
    pfVar10 = (fdb_kvs_handle *)pcVar19;
    pfStack_1460 = (fdb_kvs_handle *)0x1130f0;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130f0:
    pfStack_1460 = (fdb_kvs_handle *)0x1130f5;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130f5:
    pfStack_1460 = (fdb_kvs_handle *)0x1130fa;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130fa:
    pfStack_1460 = (fdb_kvs_handle *)0x1130ff;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130ff:
    pfStack_1460 = (fdb_kvs_handle *)0x113104;
    in_memory_snapshot_on_dirty_hbtrie_test();
    pcVar19 = (char *)pfVar10;
LAB_00113104:
    pfStack_1460 = (fdb_kvs_handle *)0x113109;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113109:
    pfStack_1460 = (fdb_kvs_handle *)0x11310e;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011310e:
    pfStack_1460 = (fdb_kvs_handle *)0x113113;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113113:
    pfStack_1460 = (fdb_kvs_handle *)0x113118;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113118:
    pfStack_1460 = (fdb_kvs_handle *)0x11311d;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011311d:
    pfStack_1460 = (fdb_kvs_handle *)0x113122;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113122:
    pfStack_1460 = (fdb_kvs_handle *)0x113127;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113127:
    pfStack_1460 = (fdb_kvs_handle *)0x11312c;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011312c:
    pfStack_1460 = (fdb_kvs_handle *)0x113131;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113131:
    pfStack_1460 = (fdb_kvs_handle *)0x113136;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113136:
    pfStack_1460 = (fdb_kvs_handle *)0x11313b;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011313b:
    pfStack_1460 = (fdb_kvs_handle *)0x113140;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113140:
    pfStack_1460 = (fdb_kvs_handle *)0x113145;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113145:
    pfStack_1460 = (fdb_kvs_handle *)0x11314a;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011314a:
    pfStack_1460 = (fdb_kvs_handle *)0x11314f;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011314f:
    pfStack_1460 = (fdb_kvs_handle *)0x113154;
    in_memory_snapshot_on_dirty_hbtrie_test();
  }
  pfStack_1460 = (fdb_kvs_handle *)in_memory_snapshot_compaction_test;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfStack_1878 = (fdb_kvs_handle *)0x113179;
  pfStack_1488 = pfVar14;
  pfStack_1480 = (fdb_kvs_handle *)unaff_R12;
  pfStack_1478 = (fdb_kvs_handle *)unaff_R13;
  pfStack_1470 = (fdb_kvs_handle *)pcVar19;
  pfStack_1468 = (fdb_kvs_handle *)handle_00;
  pfStack_1460 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday(&tStack_17a0,(__timezone_ptr_t)0x0);
  auStack_1868._4_2_ = 100;
  auStack_1868._0_4_ = 0x3530256b;
  auStack_1840._8_2_ = 100;
  auStack_1840._0_8_ = 0x38302565756c6176;
  builtin_strncpy(acStack_1588,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_1590 = (fdb_kvs_handle *)0x202066722d206d72;
  pfStack_1878 = (fdb_kvs_handle *)0x1131c6;
  system((char *)&pfStack_1590);
  pfStack_1878 = (fdb_kvs_handle *)0x1131cb;
  memleak_start();
  pfStack_1878 = (fdb_kvs_handle *)0x1131d5;
  pfVar10 = (fdb_kvs_handle *)malloc(0x20);
  pfVar14 = (fdb_kvs_handle *)((long)apbStack_1790 + 0x108);
  pfStack_1878 = (fdb_kvs_handle *)0x1131e8;
  fdb_get_default_config();
  uStack_1668 = 0x201;
  auStack_1688[0x18] = '\x01';
  auStack_1688._16_8_ = (fdb_txn *)0x2;
  uStack_1648 = 1;
  auStack_1688._8_8_ = (fdb_log_callback)0x0;
  pcStack_1630 = cb_inmem_snap;
  uStack_1628 = 2;
  pfStack_1620 = (fdb_txn *)auStack_1810;
  pfStack_1878 = (fdb_kvs_handle *)0x113232;
  fdb_get_default_kvs_config();
  pfStack_1878 = (fdb_kvs_handle *)0x113246;
  fVar5 = fdb_open(&pfStack_1860,"./mvcc_test",(fdb_config *)pfVar14);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    in_RCX = (fdb_kvs_handle *)(auStack_1810 + 0x28);
    pfStack_1878 = (fdb_kvs_handle *)0x11326c;
    fVar5 = fdb_kvs_open(pfStack_1860,(fdb_kvs_handle **)(auStack_1840 + 0x10),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011364f;
    in_RCX = (fdb_kvs_handle *)(auStack_1810 + 0x28);
    pfStack_1878 = (fdb_kvs_handle *)0x113292;
    fVar5 = fdb_kvs_open(pfStack_1860,(fdb_kvs_handle **)(auStack_1840 + 0x18),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113654;
    auStack_1810._0_8_ = auStack_1840._24_8_;
    auStack_1810._8_8_ = (btree *)0xa;
    auStack_1810._24_8_ = auStack_1868;
    handle_00 = auStack_1840;
    auStack_1810._16_4_ = 0x20;
    pfVar14 = (fdb_kvs_handle *)((long)&pfVar10->kvs + 2);
    unaff_R12 = (char *)apbStack_1790;
    handle._M_i = 0;
    auStack_1810._32_8_ = handle_00;
    do {
      pfStack_1878 = (fdb_kvs_handle *)0x1132ee;
      sprintf(unaff_R12,auStack_1868,handle._M_i);
      *(undefined4 *)&pfVar10->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar10->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)((long)&pfVar10->kvs + 6) = 0x3e;
      *(undefined4 *)&pfVar14->kvs_config = 0x646e653c;
      pfStack_1878 = (fdb_kvs_handle *)0x113319;
      sprintf((char *)pfVar10,handle_00,handle._M_i);
      unaff_R13 = (char *)auStack_1840._16_8_;
      pfStack_1878 = (fdb_kvs_handle *)0x113326;
      sVar9 = strlen(unaff_R12);
      pfStack_1878 = (fdb_kvs_handle *)0x11333e;
      in_RCX = pfVar10;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,unaff_R12,sVar9 + 1,pfVar10,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_1878 = (fdb_kvs_handle *)0x113614;
        in_memory_snapshot_compaction_test();
        goto LAB_00113614;
      }
      uVar18 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar18;
    } while (uVar18 != 10);
    pfStack_1878 = (fdb_kvs_handle *)0x11335c;
    fVar5 = fdb_commit(pfStack_1860,'\x01');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113659;
    pfStack_1878 = (fdb_kvs_handle *)0x113375;
    fVar5 = fdb_compact(pfStack_1860,"./mvcc_test2");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011365e;
    pfStack_1878 = (fdb_kvs_handle *)0x113393;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1840._16_8_,&pfStack_1858,0xffffffffffffffff
                             );
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113663;
    pfStack_1878 = (fdb_kvs_handle *)0x1133ad;
    fVar5 = fdb_get_kvs_info(pfStack_1858,(fdb_kvs_info *)&phStack_17d0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113668;
    if (pkStack_17c8 != (kvs_ops_stat *)0xb) {
      pfStack_1878 = (fdb_kvs_handle *)0x1133cd;
      in_memory_snapshot_compaction_test();
    }
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_1878 = (fdb_kvs_handle *)0x1133ed;
    fVar5 = fdb_iterator_init(pfStack_1858,&pfStack_1848,(void *)0x0,0,(void *)0x0,0,0);
    pfVar21 = (fdb_kvs_handle *)unaff_R12;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011366d;
    handle_00 = (char *)apbStack_1790;
    handle._M_i = 0;
    do {
      pfStack_1850 = (fdb_kvs_handle *)0x0;
      pfStack_1878 = (fdb_kvs_handle *)0x113417;
      fVar5 = fdb_iterator_get(pfStack_1848,(fdb_doc **)&pfStack_1850);
      unaff_R12 = (char *)pfStack_1850;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      if ((uint)handle._M_i < 10) {
        pfStack_1878 = (fdb_kvs_handle *)0x113435;
        sprintf(handle_00,auStack_1868,handle._M_i);
        *(undefined4 *)&pfVar10->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar10->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar10->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp + 6) = 0x78787878;
        *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar10->kvs_config).custom_cmp_param + 6) = 0x78787878;
        *(undefined2 *)((long)&pfVar10->kvs + 6) = 0x3e;
        *(undefined4 *)&pfVar14->kvs_config = 0x646e653c;
        pfStack_1878 = (fdb_kvs_handle *)0x113462;
        sprintf((char *)pfVar10,auStack_1840,handle._M_i);
        unaff_R12 = (char *)pfStack_1850;
        unaff_R13 = (char *)pfStack_1850->op_stats;
        pfStack_1878 = (fdb_kvs_handle *)0x11347b;
        iVar6 = bcmp(unaff_R13,handle_00,*(size_t *)&pfStack_1850->kvs_config);
        if (iVar6 != 0) goto LAB_0011362f;
        unaff_R13 = (char *)(((fdb_kvs_handle *)unaff_R12)->field_6).seqtree;
        pfStack_1878 = (fdb_kvs_handle *)0x113498;
        iVar6 = bcmp(unaff_R13,pfVar10,
                     (size_t)(((fdb_kvs_handle *)unaff_R12)->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_0011363f;
      }
      else {
        apbStack_1790[0] = (btreeblk_handle *)0x79656b5f77656e;
        *(undefined8 *)&pfVar10->kvs_config = 0x756c61765f77656e;
        *(undefined2 *)&(pfVar10->kvs_config).custom_cmp = 0x65;
        unaff_R13 = (char *)pfStack_1850->op_stats;
        pfStack_1878 = (fdb_kvs_handle *)0x1134df;
        iVar6 = bcmp(unaff_R13,handle_00,*(size_t *)&pfStack_1850->kvs_config);
        if (iVar6 != 0) goto LAB_00113614;
        unaff_R13 = (char *)(((fdb_kvs_handle *)unaff_R12)->field_6).seqtree;
        pfStack_1878 = (fdb_kvs_handle *)0x1134fc;
        iVar6 = bcmp(unaff_R13,pfVar10,
                     (size_t)(((fdb_kvs_handle *)unaff_R12)->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_00113624;
      }
      handle._M_i = (__int_type)((uint)handle._M_i + 1);
      pfStack_1878 = (fdb_kvs_handle *)0x11350e;
      fdb_doc_free((fdb_doc *)unaff_R12);
      pfStack_1878 = (fdb_kvs_handle *)0x113518;
      fVar5 = fdb_iterator_next(pfStack_1848);
      pfVar21 = (fdb_kvs_handle *)unaff_R12;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)handle._M_i != 0xb) goto LAB_00113672;
    pfStack_1878 = (fdb_kvs_handle *)0x113533;
    fVar5 = fdb_iterator_close(pfStack_1848);
    pfVar15 = pfStack_1858;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113677;
    handle_00 = (char *)apbStack_1790;
    pfStack_1878 = (fdb_kvs_handle *)0x113550;
    sVar9 = strlen(handle_00);
    in_RCX = (fdb_kvs_handle *)(auStack_1840 + 0x28);
    pfStack_1878 = (fdb_kvs_handle *)0x113569;
    fVar5 = fdb_get_kv(pfVar15,handle_00,sVar9 + 1,(void **)in_RCX,(size_t *)(auStack_1840 + 0x20));
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011367c;
    pfStack_1878 = (fdb_kvs_handle *)0x113586;
    pfVar14 = pfVar10;
    iVar6 = bcmp((void *)auStack_1840._40_8_,pfVar10,auStack_1840._32_8_);
    pfVar15 = (fdb_kvs_handle *)auStack_1840._40_8_;
    if (iVar6 != 0) goto LAB_00113681;
    pfStack_1878 = (fdb_kvs_handle *)0x113596;
    fdb_free_block((void *)auStack_1840._40_8_);
    pfStack_1878 = (fdb_kvs_handle *)0x1135a0;
    fdb_kvs_close(pfStack_1858);
    pfStack_1878 = (fdb_kvs_handle *)0x1135aa;
    fVar5 = fdb_close(pfStack_1860);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011368c;
    pfStack_1878 = (fdb_kvs_handle *)0x1135b7;
    fVar5 = fdb_shutdown();
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_1878 = (fdb_kvs_handle *)0x1135c7;
      free(pfVar10);
      pfStack_1878 = (fdb_kvs_handle *)0x1135cc;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (in_memory_snapshot_compaction_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_1878 = (fdb_kvs_handle *)0x1135fd;
      fprintf(_stderr,pcVar19,"in-memory snapshot with concurrent compaction test");
      return;
    }
  }
  else {
LAB_0011364a:
    pfStack_1878 = (fdb_kvs_handle *)0x11364f;
    in_memory_snapshot_compaction_test();
LAB_0011364f:
    pfStack_1878 = (fdb_kvs_handle *)0x113654;
    in_memory_snapshot_compaction_test();
LAB_00113654:
    pfStack_1878 = (fdb_kvs_handle *)0x113659;
    in_memory_snapshot_compaction_test();
LAB_00113659:
    pfStack_1878 = (fdb_kvs_handle *)0x11365e;
    in_memory_snapshot_compaction_test();
LAB_0011365e:
    pfStack_1878 = (fdb_kvs_handle *)0x113663;
    in_memory_snapshot_compaction_test();
LAB_00113663:
    pfStack_1878 = (fdb_kvs_handle *)0x113668;
    in_memory_snapshot_compaction_test();
LAB_00113668:
    pfStack_1878 = (fdb_kvs_handle *)0x11366d;
    in_memory_snapshot_compaction_test();
    pfVar21 = (fdb_kvs_handle *)unaff_R12;
LAB_0011366d:
    pfStack_1878 = (fdb_kvs_handle *)0x113672;
    in_memory_snapshot_compaction_test();
LAB_00113672:
    pfStack_1878 = (fdb_kvs_handle *)0x113677;
    in_memory_snapshot_compaction_test();
LAB_00113677:
    pfVar15 = pfVar14;
    pfStack_1878 = (fdb_kvs_handle *)0x11367c;
    in_memory_snapshot_compaction_test();
LAB_0011367c:
    pfStack_1878 = (fdb_kvs_handle *)0x113681;
    in_memory_snapshot_compaction_test();
LAB_00113681:
    pfStack_1878 = (fdb_kvs_handle *)0x11368c;
    pfVar14 = pfVar15;
    in_memory_snapshot_compaction_test();
LAB_0011368c:
    pfStack_1878 = (fdb_kvs_handle *)0x113691;
    in_memory_snapshot_compaction_test();
  }
  pfStack_1878 = (fdb_kvs_handle *)cb_inmem_snap;
  in_memory_snapshot_compaction_test();
  uVar17 = (ulong)pfVar14 & 0xffffffff;
  _Var13._M_i = 0;
  pcStack_1b30 = (code *)0x1136be;
  pfStack_18a0 = pfVar10;
  pfStack_1898 = pfVar21;
  pfStack_1890 = (fdb_kvs_handle *)unaff_R13;
  pfStack_1888 = pfVar15;
  pfStack_1880 = (fdb_kvs_handle *)handle_00;
  pfStack_1878 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)auStack_1ab8,(__timezone_ptr_t)0x0);
  if ((int)pfVar14 != 2) {
    return;
  }
  __s = extraout_RDX;
  if (extraout_RDX == (btree *)0x0) {
LAB_00113be0:
    pcStack_1b30 = (code *)0x113be5;
    cb_inmem_snap();
LAB_00113be5:
    pcStack_1b30 = (code *)0x113bea;
    cb_inmem_snap();
LAB_00113bea:
    pcStack_1b30 = (code *)0x113bef;
    cb_inmem_snap();
LAB_00113bef:
    pcStack_1b30 = (code *)0x113bf4;
    cb_inmem_snap();
LAB_00113bf4:
    pcStack_1b30 = (code *)0x113bf9;
    cb_inmem_snap();
LAB_00113bf9:
    pcStack_1b30 = (code *)0x113bfe;
    cb_inmem_snap();
LAB_00113bfe:
    pcStack_1b30 = (code *)0x113c03;
    cb_inmem_snap();
    pfVar14 = (fdb_kvs_handle *)unaff_R13;
LAB_00113c03:
    pcStack_1b30 = (code *)0x113c08;
    cb_inmem_snap();
LAB_00113c08:
    pfVar10 = in_RCX;
    pcStack_1b30 = (code *)0x113c0d;
    cb_inmem_snap();
LAB_00113c0d:
    pcStack_1b30 = (code *)0x113c12;
    cb_inmem_snap();
  }
  else {
    unaff_R13 = (char *)CONCAT26(auStack_1868._6_2_,CONCAT24(auStack_1868._4_2_,auStack_1868._0_4_))
    ;
    pfVar14 = (fdb_kvs_handle *)(ulong)*(byte *)&in_RCX->file;
    iVar6 = *(int *)((long)&(((atomic<unsigned_long> *)
                             &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                            super___atomic_base<unsigned_long>)._M_i + 4);
    *(int *)((long)&(((atomic<unsigned_long> *)
                     &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                    super___atomic_base<unsigned_long>)._M_i + 4) = iVar6 + 1;
    if (iVar6 != 4) {
      if (iVar6 != 1) {
        return;
      }
      pcStack_1b30 = (code *)0x11370e;
      fVar5 = fdb_snapshot_open((fdb_kvs_handle *)
                                *(__atomic_base<unsigned_long> *)
                                 &((fdb_kvs_handle *)unaff_R13)->kvs_config,&pfStack_1b18,
                                0xffffffffffffffff);
      _Var13._M_i = (__int_type)pfVar14;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113be5;
      pcStack_1b30 = (code *)0x113725;
      fVar5 = fdb_get_kvs_info(pfStack_1b18,&fStack_1ae8);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113bef;
      in_RCX = (fdb_kvs_handle *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp;
      if (fStack_1ae8.last_seqnum !=
          (long)(int)(((atomic<unsigned_long> *)
                      &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                     super___atomic_base<unsigned_long>)._M_i) {
        pcStack_1b30 = (code *)0x113b4e;
        cb_inmem_snap();
      }
      pcStack_1b30 = (code *)0x11376a;
      pfStack_1b08 = pfVar14;
      paStack_1b00 = (atomic<unsigned_long> *)in_RCX;
      fVar5 = fdb_iterator_init(pfStack_1b18,&pfStack_1b20,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar5 == FDB_RESULT_SUCCESS) {
        __s = (btree *)(auStack_1ab8 + 10);
        uVar17 = 0;
        do {
          pfStack_1b10 = (fdb_kvs_handle *)0x0;
          pcStack_1b30 = (code *)0x1137a1;
          fVar5 = fdb_iterator_get(pfStack_1b20,(fdb_doc **)&pfStack_1b10);
          if (fVar5 != FDB_RESULT_SUCCESS) break;
          lVar22 = CONCAT26(auStack_1868._6_2_,CONCAT24(auStack_1868._4_2_,auStack_1868._0_4_));
          pcStack_1b30 = (code *)0x1137c1;
          sprintf(auStack_1aa8 + 0x100,*(char **)(lVar22 + 0x18),uVar17);
          sVar9 = (size_t)*(int *)(lVar22 + 0x10);
          pcStack_1b30 = (code *)0x1137d5;
          memset(auStack_1aa8,0x78,sVar9);
          *(undefined4 *)(&__s->ksize + sVar9) = 0x646e653c;
          *(undefined2 *)((long)&uStack_1aaa + sVar9) = 0x3e;
          pcStack_1b30 = (code *)0x1137f5;
          sprintf(auStack_1aa8,*(char **)(lVar22 + 0x20),uVar17);
          unaff_R13 = (char *)pfStack_1b10;
          in_RCX = (fdb_kvs_handle *)pfStack_1b10->op_stats;
          pcStack_1b30 = (code *)0x11380d;
          iVar6 = bcmp(in_RCX,auStack_1aa8 + 0x100,*(size_t *)&pfStack_1b10->kvs_config);
          if (iVar6 != 0) {
            pcStack_1b30 = (code *)0x113b90;
            cb_inmem_snap();
LAB_00113b90:
            pcStack_1b30 = (code *)0x113ba0;
            cb_inmem_snap();
            goto LAB_00113ba0;
          }
          in_RCX = (fdb_kvs_handle *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
          pcStack_1b30 = (code *)0x113828;
          iVar6 = bcmp(in_RCX,auStack_1aa8,
                       (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
          if (iVar6 != 0) goto LAB_00113b90;
          uVar17 = (ulong)((int)uVar17 + 1);
          pcStack_1b30 = (code *)0x11383a;
          fdb_doc_free((fdb_doc *)unaff_R13);
          pcStack_1b30 = (code *)0x113844;
          fVar5 = fdb_iterator_next(pfStack_1b20);
        } while (fVar5 == FDB_RESULT_SUCCESS);
        if ((int)uVar17 != (int)(paStack_1b00->super___atomic_base<unsigned_long>)._M_i) {
          pcStack_1b30 = (code *)0x113b6c;
          cb_inmem_snap();
        }
        pcStack_1b30 = (code *)0x113863;
        fVar5 = fdb_iterator_close(pfStack_1b20);
        pfVar14 = pfStack_1b08;
        if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00113b21;
        pcStack_1b30 = (code *)0x113875;
        cb_inmem_snap();
        goto LAB_00113875;
      }
      goto LAB_00113bf9;
    }
LAB_00113875:
    in_RCX = (fdb_kvs_handle *)(auStack_1aa8 + 0x100);
    auStack_1aa8._256_4_ = 0x5f77656e;
    auStack_1aa8[0x104] = 'k';
    auStack_1aa8[0x105] = 'e';
    auStack_1aa8[0x106] = 'y';
    auStack_1aa8[0x107] = '\0';
    __s = (btree *)auStack_1aa8;
    auStack_1aa8[0] = 'n';
    auStack_1aa8[1] = 'e';
    auStack_1aa8._2_2_ = 0x5f77;
    auStack_1aa8._4_4_ = 0x756c6176;
    auStack_1aa8._8_2_ = 0x65;
    _Var13._M_i = *(__int_type *)&((fdb_kvs_handle *)unaff_R13)->kvs_config;
    pcStack_1b30 = (code *)0x1138b7;
    pfStack_1b08 = pfVar14;
    sVar9 = strlen((char *)in_RCX);
    pfVar21 = (fdb_kvs_handle *)(sVar9 + 1);
    pcStack_1b30 = (code *)0x1138c3;
    sVar9 = strlen((char *)__s);
    pcStack_1b30 = (code *)0x1138d8;
    fVar5 = fdb_set_kv((fdb_kvs_handle *)_Var13._M_i,in_RCX,(size_t)pfVar21,__s,sVar9 + 1);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113bea;
    pcStack_1b30 = (code *)0x1138f5;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)
                              *(__atomic_base<unsigned_long> *)
                               &((fdb_kvs_handle *)unaff_R13)->kvs_config,&pfStack_1b18,
                              0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113bf4;
    pcStack_1b30 = (code *)0x11390c;
    fVar5 = fdb_get_kvs_info(pfStack_1b18,&fStack_1ae8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113bfe;
    in_RCX = (fdb_kvs_handle *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp;
    if (fStack_1ae8.last_seqnum !=
        (long)(int)(((atomic<unsigned_long> *)
                    &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                   super___atomic_base<unsigned_long>)._M_i + 1U) {
      pcStack_1b30 = (code *)0x113b60;
      cb_inmem_snap();
    }
    pcStack_1b30 = (code *)0x11394a;
    fVar5 = fdb_iterator_init(pfStack_1b18,&pfStack_1b20,(void *)0x0,0,(void *)0x0,0,0);
    pfVar14 = (fdb_kvs_handle *)unaff_R13;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113c03;
    pcVar19 = auStack_1aa8 + 0x100;
    pfVar21 = (fdb_kvs_handle *)auStack_1aa8;
    uVar17 = 0;
    do {
      pfStack_1b10 = (fdb_kvs_handle *)0x0;
      pcStack_1b30 = (code *)0x11397c;
      fVar5 = fdb_iterator_get(pfStack_1b20,(fdb_doc **)&pfStack_1b10);
      unaff_R13 = (char *)pfStack_1b10;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      if ((int)uVar17 <
          (int)(((atomic<unsigned_long> *)in_RCX)->super___atomic_base<unsigned_long>)._M_i) {
        lVar22 = CONCAT26(auStack_1868._6_2_,CONCAT24(auStack_1868._4_2_,auStack_1868._0_4_));
        pcStack_1b30 = (code *)0x1139a4;
        sprintf(pcVar19,*(char **)(lVar22 + 0x18),uVar17);
        sVar9 = (size_t)*(int *)(lVar22 + 0x10);
        pcStack_1b30 = (code *)0x1139b8;
        memset(pfVar21,0x78,sVar9);
        *(undefined4 *)(auStack_1ab8 + sVar9 + 10) = 0x646e653c;
        *(undefined2 *)((long)&uStack_1aaa + sVar9) = 0x3e;
        pcStack_1b30 = (code *)0x1139dd;
        sprintf((char *)pfVar21,*(char **)(lVar22 + 0x20),uVar17);
        unaff_R13 = (char *)pfStack_1b10;
        __s = (btree *)(((atomic<unsigned_long> *)&pfStack_1b10->op_stats)->
                       super___atomic_base<unsigned_long>)._M_i;
        pcStack_1b30 = (code *)0x1139f5;
        iVar6 = bcmp(__s,pcVar19,
                     (__int_type)*(__atomic_base<unsigned_long> *)&pfStack_1b10->kvs_config);
        if (iVar6 != 0) goto LAB_00113bb0;
        __s = (((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pcStack_1b30 = (code *)0x113a10;
        iVar6 = bcmp(__s,pfVar21,
                     (((atomic<unsigned_long> *)
                      &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param)->
                     super___atomic_base<unsigned_long>)._M_i);
        if (iVar6 != 0) goto LAB_00113bc0;
      }
      else {
        auStack_1aa8._256_4_ = 0x5f77656e;
        auStack_1aa8[0x104] = 'k';
        auStack_1aa8[0x105] = 'e';
        auStack_1aa8[0x106] = 'y';
        auStack_1aa8[0x107] = '\0';
        auStack_1aa8[0] = 'n';
        auStack_1aa8[1] = 'e';
        auStack_1aa8._2_2_ = 0x5f77;
        auStack_1aa8._4_4_ = 0x756c6176;
        auStack_1aa8._8_2_ = 0x65;
        __s = (btree *)(((atomic<unsigned_long> *)&pfStack_1b10->op_stats)->
                       super___atomic_base<unsigned_long>)._M_i;
        pcStack_1b30 = (code *)0x113a5f;
        iVar6 = bcmp(__s,pcVar19,
                     (__int_type)*(__atomic_base<unsigned_long> *)&pfStack_1b10->kvs_config);
        if (iVar6 != 0) goto LAB_00113bd0;
        __s = (((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pcStack_1b30 = (code *)0x113a7a;
        iVar6 = bcmp(__s,pfVar21,
                     (((atomic<unsigned_long> *)
                      &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param)->
                     super___atomic_base<unsigned_long>)._M_i);
        if (iVar6 != 0) goto LAB_00113ba0;
      }
      uVar17 = (ulong)((int)uVar17 + 1);
      pcStack_1b30 = (code *)0x113a8c;
      fdb_doc_free((fdb_doc *)unaff_R13);
      pcStack_1b30 = (code *)0x113a96;
      fVar5 = fdb_iterator_next(pfStack_1b20);
      pfVar14 = (fdb_kvs_handle *)unaff_R13;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)uVar17 !=
        (int)(((atomic<unsigned_long> *)in_RCX)->super___atomic_base<unsigned_long>)._M_i + 1) {
      pcStack_1b30 = (code *)0x113b7b;
      cb_inmem_snap();
    }
    pcStack_1b30 = (code *)0x113ab4;
    fVar5 = fdb_iterator_close(pfStack_1b20);
    _Var13._M_i = (__int_type)pfStack_1b08;
    pfVar10 = pfStack_1b18;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113c08;
    __s = (btree *)(auStack_1aa8 + 0x100);
    pcStack_1b30 = (code *)0x113ad6;
    sVar9 = strlen((char *)__s);
    pcStack_1b30 = (code *)0x113aef;
    fVar5 = fdb_get_kv(pfVar10,__s,sVar9 + 1,&pfStack_1af0,&sStack_1af8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113c0d;
    pcStack_1b30 = (code *)0x113b11;
    iVar6 = bcmp(pfStack_1af0,auStack_1aa8,sStack_1af8);
    pfVar10 = pfStack_1af0;
    if (iVar6 == 0) {
      pcStack_1b30 = (code *)0x113b21;
      fdb_free_block(pfStack_1af0);
LAB_00113b21:
      pcStack_1b30 = (code *)0x113b2b;
      fdb_kvs_close(pfStack_1b18);
      return;
    }
  }
  pcStack_1b30 = snapshot_clone_test;
  cb_inmem_snap();
  pfStack_20a8 = (fdb_iterator *)0x113c42;
  fStack_1d50.bub_ctx.space_used = (uint64_t)pfVar10;
  fStack_1d50.bub_ctx.handle = pfVar21;
  pfStack_1b48 = pfVar14;
  pbStack_1b40 = __s;
  pfStack_1b38 = (fdb_kvs_handle *)_Var13._M_i;
  pcStack_1b30 = (code *)uVar17;
  gettimeofday(&tStack_1f78,(__timezone_ptr_t)0x0);
  pfStack_20a8 = (fdb_iterator *)0x113c47;
  memleak_start();
  pfStack_20a8 = (fdb_iterator *)0x113c56;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar15 = (fdb_kvs_handle *)&fStack_1d50.config.encryption_key;
  pfStack_20a8 = (fdb_iterator *)0x113c66;
  fdb_get_default_config();
  config = (fdb_iterator *)auStack_1f68;
  pfStack_20a8 = (fdb_iterator *)0x113c76;
  fdb_get_default_kvs_config();
  fStack_1d50.config.encryption_key.bytes[4] = '\0';
  fStack_1d50.config.encryption_key.bytes[5] = '\0';
  fStack_1d50.config.encryption_key.bytes[6] = '\0';
  fStack_1d50.config.encryption_key.bytes[7] = '\0';
  fStack_1d50.config.encryption_key.bytes[8] = '\0';
  fStack_1d50.config.encryption_key.bytes[9] = '\0';
  fStack_1d50.config.encryption_key.bytes[10] = '\0';
  fStack_1d50.config.encryption_key.bytes[0xb] = '\0';
  fStack_1d50.config.encryption_key.bytes[0xc] = '\0';
  fStack_1d50.config.encryption_key.bytes[0xd] = '\x04';
  fStack_1d50.config.encryption_key.bytes[0xe] = '\0';
  fStack_1d50.config.encryption_key.bytes[0xf] = '\0';
  fStack_1d50.config.encryption_key.bytes[0x10] = '\0';
  fStack_1d50.config.encryption_key.bytes[0x11] = '\0';
  fStack_1d50.config.encryption_key.bytes[0x12] = '\0';
  fStack_1d50.config.encryption_key.bytes[0x13] = '\0';
  fStack_1d50.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_1d50.config._180_4_ = 1;
  fStack_1d50.config.block_reusing_threshold._7_1_ = 0;
  pfStack_20a8 = (fdb_iterator *)0x113ca0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar10 = (fdb_kvs_handle *)(auStack_2088 + 0x10);
  pfStack_20a8 = (fdb_iterator *)0x113cb7;
  fVar5 = fdb_open((fdb_file_handle **)pfVar10,"./mvcc_test1",(fdb_config *)pfVar15);
  doc_00 = (fdb_iterator *)(ulong)(uint)fVar5;
  pfStack_20a8 = (fdb_iterator *)0x113cc9;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_2088._16_8_,&pfStack_2098,(fdb_kvs_config *)config);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_20a8 = (fdb_iterator *)0x113ce2;
    fVar5 = fdb_snapshot_open(pfStack_2098,(fdb_kvs_handle **)(auStack_2088 + 8),0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011469d;
    pfStack_20a8 = (fdb_iterator *)0x113cfc;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_2088._8_8_,(fdb_kvs_info *)(apfStack_1fd8 + 6));
    if ((fdb_kvs_handle *)fStack_1fa8.last_seqnum != (fdb_kvs_handle *)0x0) {
      pfStack_20a8 = (fdb_iterator *)0x113d0f;
      snapshot_clone_test();
    }
    pfVar10 = (fdb_kvs_handle *)auStack_2088;
    pfStack_20a8 = (fdb_iterator *)0x113d32;
    fdb_iterator_init((fdb_kvs_handle *)auStack_2088._8_8_,(fdb_iterator **)pfVar10,(void *)0x0,0,
                      (void *)0x0,0,0);
    pfStack_20a8 = (fdb_iterator *)0x113d3a;
    fVar5 = fdb_iterator_next((fdb_iterator *)auStack_2088._0_8_);
    pfVar16 = pfVar21;
    if (fVar5 != FDB_RESULT_ITERATOR_FAIL) goto LAB_001146a2;
    pfStack_20a8 = (fdb_iterator *)0x113d4d;
    fdb_iterator_close((fdb_iterator *)auStack_2088._0_8_);
    pfStack_20a8 = (fdb_iterator *)0x113d57;
    fdb_kvs_close((fdb_kvs_handle *)auStack_2088._8_8_);
    lVar22 = 0;
    uVar17 = 0;
    do {
      pfStack_20a8 = (fdb_iterator *)0x113d79;
      sprintf(auStack_1f68 + 0x18,"key%d",uVar17 & 0xffffffff);
      pfStack_20a8 = (fdb_iterator *)0x113d95;
      sprintf((char *)&fStack_1e50,"meta%d",uVar17 & 0xffffffff);
      pfStack_20a8 = (fdb_iterator *)0x113db1;
      sprintf((char *)&fStack_1d50,"body%d",uVar17 & 0xffffffff);
      pfStack_20a8 = (fdb_iterator *)0x113dc1;
      sVar9 = strlen(auStack_1f68 + 0x18);
      pfStack_20a8 = (fdb_iterator *)0x113dcc;
      sVar11 = strlen((char *)&fStack_1e50);
      pfStack_20a8 = (fdb_iterator *)0x113dd7;
      sVar12 = strlen((char *)&fStack_1d50);
      pfStack_20a8 = (fdb_iterator *)0x113dfc;
      fdb_doc_create((fdb_doc **)(auStack_2050 + lVar22),auStack_1f68 + 0x18,sVar9,&fStack_1e50,
                     sVar11,&fStack_1d50,sVar12);
      pfStack_20a8 = (fdb_iterator *)0x113e0b;
      fdb_set(pfStack_2098,*(fdb_doc **)(auStack_2050 + uVar17 * 8));
      uVar17 = uVar17 + 1;
      lVar22 = lVar22 + 8;
    } while (uVar17 != 5);
    pfStack_20a8 = (fdb_iterator *)0x113e2b;
    fdb_commit((fdb_file_handle *)auStack_2088._16_8_,'\x01');
    uVar17 = 5;
    ppfVar24 = (fdb_doc **)(auStack_2050 + 0x28);
    do {
      pfStack_20a8 = (fdb_iterator *)0x113e52;
      sprintf(auStack_1f68 + 0x18,"key%d",uVar17 & 0xffffffff);
      pfStack_20a8 = (fdb_iterator *)0x113e6e;
      sprintf((char *)&fStack_1e50,"meta%d",uVar17 & 0xffffffff);
      pfStack_20a8 = (fdb_iterator *)0x113e8a;
      sprintf((char *)&fStack_1d50,"body%d",uVar17 & 0xffffffff);
      pfStack_20a8 = (fdb_iterator *)0x113e92;
      sVar9 = strlen(auStack_1f68 + 0x18);
      pfStack_20a8 = (fdb_iterator *)0x113e9d;
      sVar11 = strlen((char *)&fStack_1e50);
      pfStack_20a8 = (fdb_iterator *)0x113ea8;
      sVar12 = strlen((char *)&fStack_1d50);
      pfStack_20a8 = (fdb_iterator *)0x113ec8;
      fdb_doc_create(ppfVar24,auStack_1f68 + 0x18,sVar9,&fStack_1e50,sVar11,&fStack_1d50,sVar12);
      pfStack_20a8 = (fdb_iterator *)0x113ed5;
      fdb_set(pfStack_2098,*ppfVar24);
      uVar17 = uVar17 + 1;
      ppfVar24 = ppfVar24 + 1;
    } while (uVar17 != 9);
    pfVar15 = (fdb_kvs_handle *)(auStack_1f68 + 0x18);
    pfStack_20a8 = (fdb_iterator *)0x113f04;
    sprintf((char *)pfVar15,"key%d",9);
    config = &fStack_1e50;
    pfStack_20a8 = (fdb_iterator *)0x113f22;
    sprintf((char *)config,"meta%d",9);
    pfVar16 = &fStack_1d50;
    pfStack_20a8 = (fdb_iterator *)0x113f40;
    sprintf((char *)pfVar16,"Body%d",9);
    pfVar10 = (fdb_kvs_handle *)(auStack_2050 + 0x48);
    pfStack_20a8 = (fdb_iterator *)0x113f50;
    pfVar14 = (fdb_kvs_handle *)strlen((char *)pfVar15);
    pfStack_20a8 = (fdb_iterator *)0x113f5b;
    doc_00 = (fdb_iterator *)strlen((char *)config);
    pfStack_20a8 = (fdb_iterator *)0x113f66;
    sVar9 = strlen((char *)pfVar16);
    pfStack_20a8 = (fdb_iterator *)0x113f81;
    fdb_doc_create((fdb_doc **)pfVar10,pfVar15,(size_t)pfVar14,config,(size_t)doc_00,pfVar16,sVar9);
    pfStack_20a8 = (fdb_iterator *)0x113f8e;
    fdb_set(pfStack_2098,(fdb_doc *)auStack_2050._72_8_);
    pfStack_20a8 = (fdb_iterator *)0x113f9a;
    fdb_commit((fdb_file_handle *)auStack_2088._16_8_,'\0');
    **(undefined1 **)(auStack_2050._72_8_ + 0x40) = 0x62;
    pfStack_20a8 = (fdb_iterator *)0x113fb1;
    fdb_set(pfStack_2098,(fdb_doc *)auStack_2050._72_8_);
    pfStack_20a8 = (fdb_iterator *)0x113fbd;
    fdb_commit((fdb_file_handle *)auStack_2088._16_8_,'\0');
    pfStack_2068 = *(fdb_kvs_handle **)(auStack_2050._72_8_ + 0x28);
    pfStack_20a8 = (fdb_iterator *)0x113fdf;
    fVar5 = fdb_snapshot_open(pfStack_2098,&pfStack_2058,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146a7;
    pfStack_20a8 = (fdb_iterator *)0x113ff9;
    fdb_set(pfStack_2098,(fdb_doc *)auStack_2050._72_8_);
    pfStack_20a8 = (fdb_iterator *)0x114005;
    fdb_commit((fdb_file_handle *)auStack_2088._16_8_,'\0');
    uVar17 = 10;
    pfVar10 = (fdb_kvs_handle *)0x50;
    do {
      pfStack_20a8 = (fdb_iterator *)0x11402c;
      sprintf(auStack_1f68 + 0x18,"key%d",uVar17 & 0xffffffff);
      pfStack_20a8 = (fdb_iterator *)0x114048;
      sprintf((char *)&fStack_1e50,"meta%d",uVar17 & 0xffffffff);
      pfVar16 = &fStack_1d50;
      pfStack_20a8 = (fdb_iterator *)0x114064;
      sprintf((char *)pfVar16,"body%d",uVar17 & 0xffffffff);
      doc_00 = (fdb_iterator *)(auStack_2050 + (long)pfVar10);
      pfStack_20a8 = (fdb_iterator *)0x114074;
      pfVar15 = (fdb_kvs_handle *)strlen(auStack_1f68 + 0x18);
      pfStack_20a8 = (fdb_iterator *)0x11407f;
      pfVar14 = (fdb_kvs_handle *)strlen((char *)&fStack_1e50);
      pfStack_20a8 = (fdb_iterator *)0x11408a;
      sVar9 = strlen((char *)pfVar16);
      pfStack_20a8 = (fdb_iterator *)0x1140af;
      fdb_doc_create((fdb_doc **)doc_00,auStack_1f68 + 0x18,(size_t)pfVar15,&fStack_1e50,
                     (size_t)pfVar14,pfVar16,sVar9);
      pfStack_20a8 = (fdb_iterator *)0x1140be;
      fdb_set(pfStack_2098,*(fdb_doc **)(auStack_2050 + uVar17 * 8));
      uVar17 = uVar17 + 1;
      pfVar10 = (fdb_kvs_handle *)((long)pfVar10 + 8);
    } while (uVar17 != 0xf);
    pfStack_20a8 = (fdb_iterator *)0x1140de;
    fdb_commit((fdb_file_handle *)auStack_2088._16_8_,'\x01');
    pfStack_20a8 = (fdb_iterator *)0x1140f6;
    fVar5 = fdb_set_log_callback(pfStack_2098,logCallbackFunc,"snapshot_clone_test");
    config = (fdb_iterator *)0xf;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146ac;
    pfStack_20a8 = (fdb_iterator *)0x114112;
    fVar5 = fdb_snapshot_open(pfStack_2098,(fdb_kvs_handle **)(auStack_2088 + 8),999999);
    pfVar15 = pfStack_2068;
    if (fVar5 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001146b1;
    pfStack_20a8 = (fdb_iterator *)0x114132;
    fVar5 = fdb_snapshot_open(pfStack_2098,(fdb_kvs_handle **)(auStack_2088 + 8),
                              (fdb_seqnum_t)pfStack_2068);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146b6;
    pfStack_20a8 = (fdb_iterator *)0x11414c;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2088._8_8_,&pfStack_2070,
                              (fdb_seqnum_t)pfVar15);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146bb;
    pfStack_20a8 = (fdb_iterator *)0x11415e;
    fVar5 = fdb_kvs_close((fdb_kvs_handle *)auStack_2088._8_8_);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146c0;
    pfStack_20a8 = (fdb_iterator *)0x11417b;
    fdb_get_kvs_info(pfStack_2070,(fdb_kvs_info *)(apfStack_1fd8 + 6));
    if ((fdb_kvs_handle *)fStack_1fa8.last_seqnum != pfVar15) {
      pfStack_20a8 = (fdb_iterator *)0x114191;
      snapshot_clone_test();
    }
    uVar17 = 0xf;
    config = (fdb_iterator *)apfStack_1fd8;
    do {
      pfStack_20a8 = (fdb_iterator *)0x1141b9;
      sprintf(auStack_1f68 + 0x18,"key%d",uVar17 & 0xffffffff);
      doc_00 = &fStack_1e50;
      pfStack_20a8 = (fdb_iterator *)0x1141d4;
      sprintf((char *)doc_00,"meta%d",uVar17 & 0xffffffff);
      pfVar15 = &fStack_1d50;
      pfStack_20a8 = (fdb_iterator *)0x1141ef;
      sprintf((char *)pfVar15,"body%d",uVar17 & 0xffffffff);
      pfStack_20a8 = (fdb_iterator *)0x1141f7;
      pfVar16 = (fdb_kvs_handle *)strlen(auStack_1f68 + 0x18);
      pfStack_20a8 = (fdb_iterator *)0x114202;
      pfVar14 = (fdb_kvs_handle *)strlen((char *)doc_00);
      pfStack_20a8 = (fdb_iterator *)0x11420d;
      sVar9 = strlen((char *)pfVar15);
      pfStack_20a8 = (fdb_iterator *)0x11422d;
      fdb_doc_create((fdb_doc **)config,auStack_1f68 + 0x18,(size_t)pfVar16,doc_00,(size_t)pfVar14,
                     pfVar15,sVar9);
      pfStack_20a8 = (fdb_iterator *)0x11423a;
      fdb_set(pfStack_2098,*(fdb_doc **)config);
      uVar17 = uVar17 + 1;
      config = (fdb_iterator *)((long)config + 8);
    } while (uVar17 != 0x14);
    pfStack_20a8 = (fdb_iterator *)0x114257;
    fdb_commit((fdb_file_handle *)auStack_2088._16_8_,'\0');
    pfStack_20a8 = (fdb_iterator *)0x11426d;
    fVar5 = fdb_snapshot_open(pfStack_2058,&pfStack_2060,0xffffffffffffffff);
    pfVar10 = (fdb_kvs_handle *)0x14;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146c5;
    pfVar10 = (fdb_kvs_handle *)&pfStack_2090;
    pfStack_20a8 = (fdb_iterator *)0x1142b8;
    fdb_doc_create((fdb_doc **)pfVar10,
                   (void *)(*(size_t **)
                             (auStack_2050 + (((long)pfStack_2068 << 0x20) + 0x100000000 >> 0x1d)))
                           [4],
                   **(size_t **)
                     (auStack_2050 + (((long)pfStack_2068 << 0x20) + 0x100000000 >> 0x1d)),
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_20a8 = (fdb_iterator *)0x1142c5;
    fVar5 = fdb_get_metaonly(pfStack_2070,(fdb_doc *)pfStack_2090);
    if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001146ca;
    pfStack_20a8 = (fdb_iterator *)0x1142db;
    fdb_doc_free((fdb_doc *)pfStack_2090);
    pfStack_20a8 = (fdb_iterator *)0x1142ff;
    fdb_doc_create((fdb_doc **)&pfStack_2090,*(kvs_ops_stat **)(auStack_2050._40_8_ + 0x20),
                   *(size_t *)(fdb_kvs_config *)auStack_2050._40_8_,(void *)0x0,0,(void *)0x0,0);
    pfStack_20a8 = (fdb_iterator *)0x11430c;
    fVar5 = fdb_get_metaonly(pfStack_2070,(fdb_doc *)pfStack_2090);
    pfVar21 = (fdb_kvs_handle *)auStack_2050._40_8_;
    doc_01 = pfStack_2090;
    pfVar10 = (fdb_kvs_handle *)&pfStack_2090;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146cf;
    pfVar15 = (fdb_kvs_handle *)pfStack_2090->op_stats;
    config = *(fdb_iterator **)(auStack_2050._40_8_ + 0x20);
    pfStack_20a8 = (fdb_iterator *)0x114336;
    iVar6 = bcmp(pfVar15,config,*(size_t *)(fdb_kvs_config *)auStack_2050._40_8_);
    if (iVar6 != 0) goto LAB_001146d4;
    pfVar15 = (fdb_kvs_handle *)doc_01->staletree;
    config = *(fdb_iterator **)((long)pfVar21 + 0x38);
    pfStack_20a8 = (fdb_iterator *)0x114357;
    iVar6 = bcmp(pfVar15,config,(size_t)(pfVar21->kvs_config).custom_cmp);
    if (iVar6 != 0) goto LAB_001146df;
    pfStack_20a8 = (fdb_iterator *)0x114367;
    fdb_doc_free((fdb_doc *)doc_01);
    pfStack_20a8 = (fdb_iterator *)0x114388;
    fdb_doc_create((fdb_doc **)&pfStack_2090,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    pfStack_2090->fhandle = (fdb_file_handle *)0x6;
    pfStack_20a8 = (fdb_iterator *)0x11439d;
    fVar5 = fdb_get_byseq(pfStack_2070,(fdb_doc *)pfStack_2090);
    pfVar10 = pfStack_2090;
    doc_01 = (fdb_kvs_handle *)&pfStack_2090;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146ea;
    pfVar15 = (fdb_kvs_handle *)pfStack_2090->op_stats;
    config = *(fdb_iterator **)(auStack_2050._40_8_ + 0x20);
    pfStack_20a8 = (fdb_iterator *)0x1143c6;
    iVar6 = bcmp(pfVar15,config,*(size_t *)&pfStack_2090->kvs_config);
    pfVar21 = (fdb_kvs_handle *)auStack_2050._40_8_;
    if (iVar6 != 0) goto LAB_001146ef;
    pfVar15 = (fdb_kvs_handle *)(pfVar10->field_6).seqtree;
    config = (fdb_iterator *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_2050._40_8_ + 0x40))->
             seqtree;
    pfStack_20a8 = (fdb_iterator *)0x1143e6;
    iVar6 = bcmp(pfVar15,config,(size_t)(pfVar10->kvs_config).custom_cmp_param);
    if (iVar6 != 0) goto LAB_001146fa;
    pfStack_20a8 = (fdb_iterator *)0x1143f6;
    fdb_doc_free((fdb_doc *)pfVar10);
    pfVar10 = (fdb_kvs_handle *)&pfStack_2090;
    pfStack_2090 = (fdb_kvs_handle *)0x0;
    pfVar14 = (fdb_kvs_handle *)0x0;
    pfStack_20a8 = (fdb_iterator *)0x114425;
    fdb_iterator_init(pfStack_2070,(fdb_iterator **)auStack_2088,(void *)0x0,0,(void *)0x0,0,0);
    pfVar16 = pfVar15;
    do {
      pfStack_20a8 = (fdb_iterator *)0x114432;
      fVar5 = fdb_iterator_get((fdb_iterator *)auStack_2088._0_8_,(fdb_doc **)pfVar10);
      pfVar15 = pfStack_2090;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_00114657:
        pfStack_20a8 = (fdb_iterator *)0x11465c;
        snapshot_clone_test();
        pfVar15 = pfVar16;
LAB_0011465c:
        pfStack_20a8 = (fdb_iterator *)0x114667;
        snapshot_clone_test();
LAB_00114667:
        pfStack_20a8 = (fdb_iterator *)0x114672;
        snapshot_clone_test();
        goto LAB_00114672;
      }
      config = (fdb_iterator *)pfStack_2090->op_stats;
      doc_00 = *(fdb_iterator **)(auStack_2050 + (long)pfVar14 * 8);
      pfVar21 = (fdb_kvs_handle *)doc_00->_seqnum;
      pfStack_20a8 = (fdb_iterator *)0x11445a;
      iVar6 = bcmp(config,pfVar21,*(size_t *)&pfStack_2090->kvs_config);
      pfVar16 = pfVar15;
      if (iVar6 != 0) {
        pfStack_20a8 = (fdb_iterator *)0x114657;
        snapshot_clone_test();
        goto LAB_00114657;
      }
      config = (fdb_iterator *)pfVar15->staletree;
      pfVar21 = (fdb_kvs_handle *)doc_00->tree_cursor_start;
      pfStack_20a8 = (fdb_iterator *)0x114479;
      iVar6 = bcmp(config,pfVar21,(size_t)(pfVar15->kvs_config).custom_cmp);
      if (iVar6 != 0) goto LAB_00114667;
      config = (fdb_iterator *)(pfVar15->field_6).seqtree;
      pfVar21 = (fdb_kvs_handle *)doc_00->tree_cursor_prev;
      pfStack_20a8 = (fdb_iterator *)0x114498;
      iVar6 = bcmp(config,pfVar21,(size_t)(pfVar15->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_0011465c;
      pfStack_20a8 = (fdb_iterator *)0x1144a8;
      fdb_doc_free((fdb_doc *)pfVar15);
      pfStack_2090 = (fdb_kvs_handle *)0x0;
      pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x1;
      pfStack_20a8 = (fdb_iterator *)0x1144be;
      pfVar20 = (fdb_iterator *)auStack_2088._0_8_;
      fVar5 = fdb_iterator_next((fdb_iterator *)auStack_2088._0_8_);
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)pfVar14 == 10) {
      pfStack_20a8 = (fdb_iterator *)0x1144dd;
      fdb_iterator_close((fdb_iterator *)auStack_2088._0_8_);
      pfVar14 = (fdb_kvs_handle *)0x0;
      pfStack_20a8 = (fdb_iterator *)0x1144fe;
      fdb_iterator_init(pfStack_2060,(fdb_iterator **)auStack_2088,(void *)0x0,0,(void *)0x0,0,0);
      pfVar10 = (fdb_kvs_handle *)&pfStack_2090;
      do {
        pfStack_20a8 = (fdb_iterator *)0x114510;
        fVar5 = fdb_iterator_get((fdb_iterator *)auStack_2088._0_8_,(fdb_doc **)pfVar10);
        pfVar15 = pfStack_2090;
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011467d;
        config = (fdb_iterator *)pfStack_2090->op_stats;
        doc_00 = *(fdb_iterator **)(auStack_2050 + (long)pfVar14 * 8);
        pfVar21 = (fdb_kvs_handle *)doc_00->_seqnum;
        pfStack_20a8 = (fdb_iterator *)0x114538;
        iVar6 = bcmp(config,pfVar21,*(size_t *)&pfStack_2090->kvs_config);
        if (iVar6 != 0) goto LAB_00114672;
        config = (fdb_iterator *)pfVar15->staletree;
        pfVar21 = (fdb_kvs_handle *)doc_00->tree_cursor_start;
        pfStack_20a8 = (fdb_iterator *)0x114557;
        iVar6 = bcmp(config,pfVar21,(size_t)(pfVar15->kvs_config).custom_cmp);
        if (iVar6 != 0) goto LAB_0011468d;
        config = (fdb_iterator *)(pfVar15->field_6).seqtree;
        pfVar21 = (fdb_kvs_handle *)doc_00->tree_cursor_prev;
        pfStack_20a8 = (fdb_iterator *)0x114576;
        iVar6 = bcmp(config,pfVar21,(size_t)(pfVar15->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_00114682;
        pfStack_20a8 = (fdb_iterator *)0x114586;
        fdb_doc_free((fdb_doc *)pfVar15);
        pfStack_2090 = (fdb_kvs_handle *)0x0;
        pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x1;
        pfStack_20a8 = (fdb_iterator *)0x11459c;
        pfVar20 = (fdb_iterator *)auStack_2088._0_8_;
        fVar5 = fdb_iterator_next((fdb_iterator *)auStack_2088._0_8_);
        pfVar16 = pfVar15;
      } while (fVar5 == FDB_RESULT_SUCCESS);
      if ((int)pfVar14 == 10) {
        pfStack_20a8 = (fdb_iterator *)0x1145b8;
        fdb_iterator_close((fdb_iterator *)auStack_2088._0_8_);
        pfStack_20a8 = (fdb_iterator *)0x1145c2;
        fdb_kvs_close(pfStack_2098);
        pfStack_20a8 = (fdb_iterator *)0x1145cc;
        fdb_kvs_close(pfStack_2058);
        pfStack_20a8 = (fdb_iterator *)0x1145d6;
        fdb_kvs_close(pfStack_2060);
        pfStack_20a8 = (fdb_iterator *)0x1145e0;
        fdb_kvs_close(pfStack_2070);
        pfStack_20a8 = (fdb_iterator *)0x1145ea;
        fdb_close((fdb_file_handle *)auStack_2088._16_8_);
        lVar22 = 0;
        do {
          pfStack_20a8 = (fdb_iterator *)0x1145f6;
          fdb_doc_free(*(fdb_doc **)(auStack_2050 + lVar22 * 8));
          lVar22 = lVar22 + 1;
        } while (lVar22 != 0x14);
        pfStack_20a8 = (fdb_iterator *)0x114604;
        fdb_shutdown();
        pfStack_20a8 = (fdb_iterator *)0x114609;
        memleak_end();
        pcVar19 = "%s PASSED\n";
        if (snapshot_clone_test()::__test_pass != '\0') {
          pcVar19 = "%s FAILED\n";
        }
        pfStack_20a8 = (fdb_iterator *)0x11463a;
        fprintf(_stderr,pcVar19,"snapshot clone test");
        return;
      }
      goto LAB_0011470a;
    }
  }
  else {
LAB_00114698:
    pfStack_20a8 = (fdb_iterator *)0x11469d;
    snapshot_clone_test();
LAB_0011469d:
    pfStack_20a8 = (fdb_iterator *)0x1146a2;
    snapshot_clone_test();
    pfVar16 = pfVar21;
LAB_001146a2:
    pfStack_20a8 = (fdb_iterator *)0x1146a7;
    snapshot_clone_test();
LAB_001146a7:
    pfStack_20a8 = (fdb_iterator *)0x1146ac;
    snapshot_clone_test();
LAB_001146ac:
    pfStack_20a8 = (fdb_iterator *)0x1146b1;
    snapshot_clone_test();
LAB_001146b1:
    pfStack_20a8 = (fdb_iterator *)0x1146b6;
    snapshot_clone_test();
LAB_001146b6:
    pfStack_20a8 = (fdb_iterator *)0x1146bb;
    snapshot_clone_test();
LAB_001146bb:
    pfStack_20a8 = (fdb_iterator *)0x1146c0;
    snapshot_clone_test();
LAB_001146c0:
    pfStack_20a8 = (fdb_iterator *)0x1146c5;
    snapshot_clone_test();
LAB_001146c5:
    pfStack_20a8 = (fdb_iterator *)0x1146ca;
    snapshot_clone_test();
LAB_001146ca:
    pfStack_20a8 = (fdb_iterator *)0x1146cf;
    snapshot_clone_test();
LAB_001146cf:
    pfVar21 = pfVar16;
    doc_01 = pfVar10;
    pfStack_20a8 = (fdb_iterator *)0x1146d4;
    snapshot_clone_test();
LAB_001146d4:
    pfStack_20a8 = (fdb_iterator *)0x1146df;
    snapshot_clone_test();
LAB_001146df:
    pfStack_20a8 = (fdb_iterator *)0x1146ea;
    snapshot_clone_test();
LAB_001146ea:
    pfVar10 = doc_01;
    pfStack_20a8 = (fdb_iterator *)0x1146ef;
    snapshot_clone_test();
LAB_001146ef:
    pfStack_20a8 = (fdb_iterator *)0x1146fa;
    snapshot_clone_test();
LAB_001146fa:
    pfStack_20a8 = (fdb_iterator *)0x114705;
    pfVar20 = config;
    snapshot_clone_test();
  }
  pfStack_20a8 = (fdb_iterator *)0x11470a;
  snapshot_clone_test();
LAB_0011470a:
  pfStack_20a8 = (fdb_iterator *)snap_clone_thread;
  snapshot_clone_test();
  pfStack_2100 = (fdb_doc *)0x0;
  pfVar16 = pfVar20->handle;
  iVar6 = *(int *)&pfVar20->seqtree_iterator;
  pfStack_20d0 = pfVar10;
  pfStack_20c8 = pfVar21;
  pfStack_20c0 = pfVar14;
  pfStack_20b8 = pfVar15;
  pfStack_20b0 = config;
  pfStack_20a8 = doc_00;
  gettimeofday(&tStack_20e0,(__timezone_ptr_t)0x0);
  fVar5 = fdb_snapshot_open((fdb_kvs_handle *)pfVar20->hbtrie_iterator,&pfStack_20e8,
                            0xffffffffffffffff);
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7d5);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7d5,"void *snap_clone_thread(void *)");
  }
  lVar22 = 0;
  iStack_20ec = iVar6;
  fdb_iterator_init(pfStack_20e8,&pfStack_20f8,(void *)0x0,0,(void *)0x0,0,0);
  do {
    fVar5 = fdb_iterator_get(pfStack_20f8,&pfStack_2100);
    doc = pfStack_2100;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7df);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7df,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfStack_2100->key;
    lVar2 = *(long *)(&(pfVar16->kvs_config).create_if_missing + lVar22 * 8);
    pvVar3 = *(void **)(lVar2 + 0x20);
    iVar6 = bcmp(pvVar1,pvVar3,pfStack_2100->keylen);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e0,"void *snap_clone_thread(void *)");
    }
    pvVar1 = doc->body;
    pvVar3 = *(void **)(lVar2 + 0x40);
    iVar6 = bcmp(pvVar1,pvVar3,doc->bodylen);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e1);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e1,"void *snap_clone_thread(void *)");
    }
    fdb_doc_free(doc);
    pfStack_2100 = (fdb_doc *)0x0;
    lVar22 = lVar22 + 1;
    fVar5 = fdb_iterator_next(pfStack_20f8);
  } while (fVar5 == FDB_RESULT_SUCCESS);
  if (iStack_20ec / 2 == (int)lVar22) {
    fdb_iterator_close(pfStack_20f8);
    fdb_kvs_close(pfStack_20e8);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x7e9);
  __assert_fail("count==n/2",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x7e9,"void *snap_clone_thread(void *)");
}

Assistant:

void snapshot_stats_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db;
    fdb_seqnum_t snap_seq;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_kvs_info kvs_info;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    status = fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // ------- Setup test ----------------------------------
    // insert documents
    for (i=0; i<n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
        fdb_doc_free(doc[i]);
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // retrieve the sequence number for a snapshot open
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    snap_seq = kvs_info.last_seqnum;

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "snapshot_stats_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Init Snapshot of open file with saved document seqnum as marker
    status = fdb_snapshot_open(db, &snap_db, snap_seq);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check snapshot's sequence number
    fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == snap_seq);

    TEST_CHK(kvs_info.doc_count == (size_t)n);
    TEST_CHK(kvs_info.file == dbfile);

    // close snapshot handle
    fdb_kvs_close(snap_db);

    // Test stats by creating an in-memory snapshot
    status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // check snapshot's sequence number
    fdb_get_kvs_info(snap_db, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == snap_seq);

    TEST_CHK(kvs_info.doc_count == (size_t)n);
    TEST_CHK(kvs_info.file == dbfile);

    // close snapshot handle
    fdb_kvs_close(snap_db);

    // close db handle
    fdb_kvs_close(db);
    // close db file
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("snapshot stats test");
}